

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm_int8.h
# Opt level: O2

int ncnn::convolution_im2col_gemm_int8
              (Mat *bottom_blob,Mat *top_blob,Mat *AT,int kernel_w,int kernel_h,int dilation_w,
              int dilation_h,int stride_w,int stride_h,int nT,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t sVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int *piVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  void *pvVar21;
  undefined8 *puVar22;
  undefined1 *puVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  undefined1 (*pauVar29) [64];
  int M;
  int iVar30;
  int iVar31;
  long lVar32;
  undefined1 (*pauVar33) [16];
  long lVar34;
  undefined8 *puVar35;
  undefined1 (*pauVar36) [64];
  int iVar37;
  int iVar38;
  undefined4 in_register_00000084;
  long lVar39;
  ulong uVar40;
  long lVar41;
  undefined4 *puVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  long lVar46;
  ulong uVar47;
  int iVar48;
  long lVar49;
  undefined4 *puVar50;
  undefined1 (*pauVar51) [64];
  int kk;
  int iVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  int iVar56;
  long lVar57;
  Mat *pMVar58;
  int max_kk;
  long lVar59;
  uint uVar60;
  uint uVar61;
  long lVar62;
  long lVar63;
  bool bVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  __m128i _vindex;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar116 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  long local_2c0;
  long local_2a0;
  long local_298;
  long local_278;
  long local_260;
  int TILE_N;
  ulong local_250;
  int local_244;
  int local_240;
  int local_23c;
  int TILE_K;
  int TILE_M;
  long local_230;
  Mat *local_228;
  ulong local_220;
  long local_218;
  long local_210;
  Mat local_208;
  Mat *local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  Mat local_1a8;
  Mat m;
  Mat local_108;
  Mat local_c0;
  undefined1 local_78 [64];
  
  local_230 = CONCAT44(in_register_00000084,kernel_h);
  iVar27 = kernel_h * kernel_w;
  M = top_blob->elempack * top_blob->c;
  uVar60 = top_blob->h * top_blob->w;
  uVar61 = bottom_blob->c * iVar27 * bottom_blob->elempack;
  local_228 = top_blob;
  local_1c0 = AT;
  convolution_im2col_gemm_get_optimal_tile_mnk_int8(M,uVar60,uVar61,&TILE_M,&TILE_N,&TILE_K,nT);
  local_244 = (M + TILE_M + -1) / TILE_M;
  iVar48 = (int)(uVar60 + TILE_N + -1) / TILE_N;
  iVar15 = (int)(uVar61 + TILE_K + -1) / TILE_K;
  local_1a8.cstep = 0;
  local_1a8.data = (void *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize = 0;
  local_1a8.elempack = 0;
  local_1a8.allocator = (Allocator *)0x0;
  local_1a8.dims = 0;
  local_1a8.w = 0;
  local_1a8.h = 0;
  local_1a8.d = 0;
  local_1a8.c = 0;
  local_1b8 = (ulong)uVar60;
  local_1b0 = (ulong)uVar61;
  Mat::create(&local_1a8,TILE_K * TILE_N,iVar15,iVar48,1,opt->workspace_allocator);
  local_220 = 0xffffffffffffff9c;
  if ((local_1a8.data != (void *)0x0) && ((long)local_1a8.c * local_1a8.cstep != 0)) {
    local_23c = iVar48 * iVar15;
    local_240 = CONCAT31(local_240._1_3_,
                         (stride_h == 1 &&
                         (dilation_h == 1 &&
                         (dilation_w == 1 && ((int)local_230 == 1 && kernel_w == 1)))) &&
                         stride_w == 1);
    local_220 = (ulong)(uint)~((kernel_w + -1) * dilation_w);
    iVar48 = 0;
    if (local_23c < 1) {
      local_23c = 0;
    }
    auVar76 = vpbroadcastd_avx512f();
    local_78 = vmovdqu64_avx512f(auVar76);
    pMVar58 = local_1c0;
    while (iVar48 != local_23c) {
      local_210 = CONCAT44(local_210._4_4_,iVar48);
      iVar37 = TILE_N * (iVar48 / iVar15);
      iVar56 = TILE_K * (iVar48 % iVar15);
      iVar43 = (int)local_1b8 - iVar37;
      if (TILE_N < iVar43) {
        iVar43 = TILE_N;
      }
      max_kk = (int)local_1b0 - iVar56;
      if (TILE_K < max_kk) {
        max_kk = TILE_K;
      }
      local_208.cstep = (size_t)local_1a8.w;
      local_208.data =
           (void *)((long)local_1a8.data +
                   (uint)(iVar48 % iVar15) * local_208.cstep * local_1a8.elemsize +
                   (long)(iVar48 / iVar15) * local_1a8.cstep * local_1a8.elemsize);
      local_208.refcount._0_4_ = 0;
      local_208.refcount._4_4_ = 0;
      local_208.elemsize = local_1a8.elemsize;
      local_208.elempack = local_1a8.elempack;
      local_208.allocator = local_1a8.allocator;
      local_208.dims = 2;
      local_208.w = local_1a8.w;
      local_208.h = 1;
      local_208.d = 1;
      local_208.c = 1;
      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
      iVar48 = cpu_support_x86_avx512_vnni();
      if (iVar48 == 0) {
        iVar48 = cpu_support_x86_avx_vnni_int8();
        if (iVar48 == 0) {
          iVar48 = cpu_support_x86_avx_vnni();
          if (iVar48 == 0) {
            iVar48 = (int)bottom_blob->cstep;
            if ((char)local_240 == '\0') {
              iVar4 = bottom_blob->elempack;
              iVar24 = bottom_blob->w;
              uVar61 = ((int)local_220 + iVar24) / stride_w;
              iVar38 = uVar61 + 1;
              uVar60 = 0;
              if ((uVar61 != 0) && (uVar60 = 0x1f, uVar61 != 0)) {
                for (; uVar61 >> uVar60 == 0; uVar60 = uVar60 - 1) {
                }
              }
              auVar76 = vpbroadcastd_avx512f();
              auVar77 = vpbroadcastd_avx512f();
              auVar73._0_4_ = auVar77._0_4_;
              auVar78 = vpbroadcastd_avx512f();
              iVar25 = iVar24 * stride_h;
              auVar79 = vpbroadcastd_avx512f();
              iVar24 = iVar24 * dilation_h;
              iVar30 = max_kk / 8;
              uVar40 = (long)iVar56 / 8 & 0xffffffff;
              iVar16 = 0;
              if (0 < iVar30) {
                iVar16 = iVar30;
              }
              pauVar36 = (undefined1 (*) [64])local_208.data;
              for (uVar61 = 0; (int)(uVar61 | 0xf) < iVar43; uVar61 = uVar61 + 0x10) {
                auVar80 = vpbroadcastd_avx512f();
                auVar80 = vpaddd_avx512f(auVar80,_DAT_00539980);
                auVar81 = vpmuludq_avx512f(auVar80,auVar76);
                auVar81 = vpsrlq_avx512f(auVar81,0x20);
                auVar82 = vpsrlq_avx512f(auVar80,0x20);
                auVar82 = vpmuludq_avx512f(auVar82,auVar76);
                auVar82 = vmovdqa32_avx512f(auVar82);
                auVar83._4_4_ = auVar82._4_4_;
                auVar83._0_4_ = auVar81._0_4_;
                auVar83._8_4_ = auVar81._8_4_;
                auVar83._12_4_ = auVar82._12_4_;
                auVar83._16_4_ = auVar81._16_4_;
                auVar83._20_4_ = auVar82._20_4_;
                auVar83._24_4_ = auVar81._24_4_;
                auVar83._28_4_ = auVar82._28_4_;
                auVar83._32_4_ = auVar81._32_4_;
                auVar83._36_4_ = auVar82._36_4_;
                auVar83._40_4_ = auVar81._40_4_;
                auVar83._44_4_ = auVar82._44_4_;
                auVar83._48_4_ = auVar81._48_4_;
                auVar83._52_4_ = auVar82._52_4_;
                auVar83._60_4_ = auVar82._60_4_;
                auVar83._56_4_ = auVar81._56_4_;
                auVar81 = vpsubd_avx512f(auVar80,auVar83);
                auVar81 = vpsrlvd_avx512f(auVar81,auVar77);
                auVar81 = vpaddd_avx512f(auVar81,auVar83);
                auVar81 = vpsrld_avx512f(auVar81,ZEXT416(uVar60));
                in_ZMM8 = vpmulld_avx512f(auVar81,auVar78);
                auVar80 = vpsubd_avx512f(auVar80,in_ZMM8);
                auVar80 = vpmulld_avx512f(auVar80,local_78);
                auVar81 = vpmulld_avx512f(auVar81,auVar79);
                if (stride_w == 1) {
                  in_ZMM8 = valignd_avx512f(auVar81,auVar81,0xf);
                  uVar47 = vpcmpeqd_avx512f(auVar81,in_ZMM8);
                  if ((uVar47 & 1) == 0) goto LAB_001981d3;
                  auVar65 = vpaddd_avx(auVar80._0_16_,auVar81._0_16_);
                  iVar31 = auVar65._0_4_;
                  if (iVar4 == 1) {
                    for (iVar52 = 0; iVar52 + 1 < max_kk; iVar52 = iVar52 + 2) {
                      uVar47 = (long)(iVar56 + iVar52) % (long)iVar27;
                      iVar17 = iVar56 + iVar52 + 1;
                      uVar8 = (long)iVar17 % (long)iVar27;
                      uVar47 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
                      uVar8 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
                      auVar65 = *(undefined1 (*) [16])
                                 ((long)bottom_blob->data +
                                 (long)((int)((long)uVar47 % (long)kernel_w) * dilation_w +
                                        ((iVar56 + iVar52) / iVar27) * iVar48 + iVar31 +
                                       (int)((long)uVar47 / (long)kernel_w) * iVar24));
                      auVar66 = *(undefined1 (*) [16])
                                 ((long)bottom_blob->data +
                                 (long)((int)((long)uVar8 % (long)kernel_w) * dilation_w +
                                        (iVar17 / iVar27) * iVar48 + iVar31 +
                                       (int)((long)uVar8 / (long)kernel_w) * iVar24));
                      auVar110 = vpunpcklbw_avx(auVar65,auVar66);
                      in_ZMM8 = ZEXT1664(auVar110);
                      auVar65 = vpunpckhbw_avx(auVar65,auVar66);
                      *(undefined1 (*) [16])*pauVar36 = auVar110;
                      *(undefined1 (*) [16])(*pauVar36 + 0x10) = auVar65;
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x20);
                    }
                    for (; iVar52 < max_kk; iVar52 = iVar52 + 1) {
                      uVar47 = (long)(iVar56 + iVar52) % (long)iVar27;
                      uVar47 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
                      *(undefined1 (*) [16])*pauVar36 =
                           *(undefined1 (*) [16])
                            ((long)bottom_blob->data +
                            (long)((int)((long)uVar47 % (long)kernel_w) * dilation_w +
                                   ((iVar56 + iVar52) / iVar27) * iVar48 + iVar31 +
                                  (int)((long)uVar47 / (long)kernel_w) * iVar24));
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x10);
                    }
                  }
                  uVar47 = uVar40;
                  iVar52 = iVar16;
                  if (iVar4 == 8) {
                    while (iVar52 != 0) {
                      iVar17 = (int)uVar47;
                      uVar47 = (ulong)(uint)((int)((long)iVar17 % (long)iVar27) >> 0x1f) << 0x20 |
                               (long)iVar17 % (long)iVar27 & 0xffffffffU;
                      lVar18 = (long)((int)((long)uVar47 % (long)kernel_w) * dilation_w +
                                      (iVar17 / iVar27) * iVar48 + iVar31 +
                                     (int)((long)uVar47 / (long)kernel_w) * iVar24);
                      auVar80 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                   ((long)bottom_blob->data + lVar18 * 8));
                      auVar81 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                   ((long)bottom_blob->data + lVar18 * 8 + 0x40));
                      auVar82 = vpunpcklwd_avx512bw(auVar80,auVar81);
                      auVar80 = vpunpckhwd_avx512bw(auVar80,auVar81);
                      auVar81 = vpunpcklwd_avx512bw(auVar82,auVar80);
                      auVar80 = vpunpckhwd_avx512bw(auVar82,auVar80);
                      auVar82 = vshufi64x2_avx512f(auVar81,auVar80,0x88);
                      auVar80 = vshufi64x2_avx512f(auVar81,auVar80,0xdd);
                      auVar81 = vpunpckldq_avx512f(auVar82,auVar80);
                      auVar80 = vpunpckhdq_avx512f(auVar82,auVar80);
                      auVar82 = vshufi64x2_avx512f(auVar81,auVar80,0x88);
                      auVar80 = vshufi64x2_avx512f(auVar81,auVar80,0xdd);
                      auVar81 = vpunpcklqdq_avx512f(auVar82,auVar80);
                      auVar80 = vpunpckhqdq_avx512f(auVar82,auVar80);
                      in_ZMM8 = vinserti64x4_avx512f(auVar81,auVar80._0_32_,1);
                      auVar80 = vshufi64x2_avx512f(auVar81,auVar80,0xee);
                      auVar81 = vshufi64x2_avx512f(in_ZMM8,auVar80,0x88);
                      auVar82 = vshufi64x2_avx512f(in_ZMM8,auVar80,0xdd);
                      auVar80 = vmovdqu64_avx512f(auVar81);
                      *pauVar36 = auVar80;
                      auVar80 = vmovdqu64_avx512f(auVar82);
                      pauVar36[1] = auVar80;
                      pauVar36 = pauVar36 + 2;
                      uVar47 = (ulong)(iVar17 + 1);
                      iVar52 = iVar52 + -1;
                    }
                  }
                }
                else {
LAB_001981d3:
                  auVar80 = vpaddd_avx512f(auVar80,auVar81);
                  if (iVar4 == 1) {
                    for (iVar31 = 0; iVar31 + 1 < max_kk; iVar31 = iVar31 + 2) {
                      auVar81 = vpbroadcastd_avx512f();
                      vpaddd_avx512f(auVar81,auVar80);
                      auVar81 = vpbroadcastd_avx512f();
                      vpaddd_avx512f(auVar81,auVar80);
                      auVar81 = vpgatherdd_avx512f(*(undefined4 *)
                                                    ((long)bottom_blob->data +
                                                    (ulong)(uint)(((iVar56 + iVar31 + 1) / iVar27) *
                                                                 iVar48)));
                      auVar82 = vpgatherdd_avx512f(*(undefined4 *)
                                                    ((long)bottom_blob->data +
                                                    (ulong)(uint)(((iVar56 + iVar31) / iVar27) *
                                                                 iVar48)));
                      auVar83 = vmovdqa64_avx512f(auVar81);
                      auVar84 = vpmovsxbd_avx512f(_DAT_00539670);
                      in_ZMM8 = vpermt2d_avx512f(auVar83,auVar84,auVar82);
                      auVar83 = vpmovsxbd_avx512f(_DAT_00539680);
                      in_ZMM9 = vpermt2d_avx512f(auVar81,auVar83,auVar82);
                      auVar65 = vpmovdb_avx512f(in_ZMM8);
                      *(undefined1 (*) [16])*pauVar36 = auVar65;
                      auVar65 = vpmovdb_avx512f(in_ZMM9);
                      *(undefined1 (*) [16])(*pauVar36 + 0x10) = auVar65;
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x20);
                    }
                    for (; iVar31 < max_kk; iVar31 = iVar31 + 1) {
                      auVar81 = vpbroadcastd_avx512f();
                      vpaddd_avx512f(auVar81,auVar80);
                      in_ZMM8 = vpgatherdd_avx512f(*(undefined4 *)
                                                    ((long)bottom_blob->data +
                                                    (ulong)(uint)(((iVar56 + iVar31) / iVar27) *
                                                                 iVar48)));
                      auVar65 = vpmovdb_avx512f(in_ZMM8);
                      *(undefined1 (*) [16])*pauVar36 = auVar65;
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x10);
                    }
                  }
                  uVar47 = uVar40;
                  iVar31 = iVar16;
                  if (iVar4 == 8) {
                    while (iVar31 != 0) {
                      auVar81 = vpbroadcastd_avx512f();
                      auVar81 = vpaddd_avx512f(auVar81,auVar80);
                      auVar81 = vpslld_avx512f(auVar81,3);
                      auVar82 = vpgatherdq_avx512f(*(undefined4 *)((long)bottom_blob->data + uVar47)
                                                  );
                      vextracti64x4_avx512f(auVar81,1);
                      auVar81 = vpgatherdq_avx512f(*(undefined4 *)((long)bottom_blob->data + uVar47)
                                                  );
                      auVar83 = vpunpcklwd_avx512bw(auVar82,auVar81);
                      auVar81 = vpunpckhwd_avx512bw(auVar82,auVar81);
                      auVar82 = vpunpcklwd_avx512bw(auVar83,auVar81);
                      auVar81 = vpunpckhwd_avx512bw(auVar83,auVar81);
                      auVar83 = vshufi64x2_avx512f(auVar82,auVar81,0x88);
                      auVar81 = vshufi64x2_avx512f(auVar82,auVar81,0xdd);
                      auVar82 = vpunpckldq_avx512f(auVar83,auVar81);
                      auVar81 = vpunpckhdq_avx512f(auVar83,auVar81);
                      auVar83 = vshufi64x2_avx512f(auVar82,auVar81,0x88);
                      auVar81 = vshufi64x2_avx512f(auVar82,auVar81,0xdd);
                      auVar82 = vpunpcklqdq_avx512f(auVar83,auVar81);
                      auVar81 = vpunpckhqdq_avx512f(auVar83,auVar81);
                      in_ZMM8 = vinserti64x4_avx512f(auVar82,auVar81._0_32_,1);
                      auVar81 = vshufi64x2_avx512f(auVar82,auVar81,0xee);
                      in_ZMM9 = vshufi64x2_avx512f(in_ZMM8,auVar81,0x88);
                      auVar82 = vshufi64x2_avx512f(in_ZMM8,auVar81,0xdd);
                      auVar81 = vmovdqu64_avx512f(in_ZMM9);
                      *pauVar36 = auVar81;
                      auVar81 = vmovdqu64_avx512f(auVar82);
                      pauVar36[1] = auVar81;
                      pauVar36 = pauVar36 + 2;
                      uVar47 = (ulong)((int)uVar47 + 1);
                      iVar31 = iVar31 + -1;
                    }
                  }
                }
              }
              auVar73._4_4_ = auVar73._0_4_;
              auVar73._8_4_ = auVar73._0_4_;
              auVar73._12_4_ = auVar73._0_4_;
              auVar73._16_4_ = auVar73._0_4_;
              auVar73._20_4_ = auVar73._0_4_;
              auVar73._24_4_ = auVar73._0_4_;
              auVar73._28_4_ = auVar73._0_4_;
              auVar68 = vpbroadcastd_avx512vl();
              auVar69 = vpbroadcastd_avx512vl();
              for (; (int)(uVar61 | 7) < iVar43; uVar61 = uVar61 + 8) {
                auVar70 = vpbroadcastd_avx512vl();
                auVar70 = vpaddd_avx2(auVar70,_DAT_0053a5c0);
                auVar115 = vpmuludq_avx2(auVar70,auVar76._0_32_);
                auVar114 = vpsrlq_avx2(auVar115,0x20);
                auVar115 = vpsrlq_avx2(auVar70,0x20);
                auVar115 = vpmuludq_avx2(auVar115,auVar76._0_32_);
                auVar114 = vpblendd_avx2(auVar114,auVar115,0xaa);
                auVar115 = vpsubd_avx2(auVar70,auVar114);
                auVar115 = vpsrlvd_avx2(auVar115,auVar73);
                auVar115 = vpaddd_avx2(auVar115,auVar114);
                auVar114 = vpsrld_avx2(auVar115,ZEXT416(uVar60));
                auVar115 = vpmulld_avx2(auVar114,auVar68);
                in_ZMM8 = ZEXT3264(auVar115);
                auVar70 = vpsubd_avx2(auVar70,auVar115);
                auVar70 = vpmulld_avx2(auVar70,local_78._0_32_);
                auVar115 = vpmulld_avx2(auVar114,auVar69);
                if (stride_w == 1) {
                  auVar65 = vpshufd_avx(auVar115._16_16_,0xff);
                  in_ZMM8 = ZEXT1664(auVar65);
                  uVar47 = vpcmpeqd_avx512vl(auVar115,ZEXT1632(auVar65));
                  if ((uVar47 & 1) == 0) goto LAB_00198794;
                  auVar65 = vpaddd_avx(auVar70._0_16_,auVar115._0_16_);
                  iVar31 = auVar65._0_4_;
                  if (iVar4 == 1) {
                    for (iVar52 = 0; iVar52 + 1 < max_kk; iVar52 = iVar52 + 2) {
                      uVar47 = (long)(iVar56 + iVar52) % (long)iVar27;
                      iVar17 = iVar56 + iVar52 + 1;
                      uVar8 = (long)iVar17 % (long)iVar27;
                      uVar47 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
                      uVar8 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
                      auVar65._8_8_ = 0;
                      auVar65._0_8_ =
                           *(ulong *)((long)bottom_blob->data +
                                     (long)((int)((long)uVar47 % (long)kernel_w) * dilation_w +
                                            ((iVar56 + iVar52) / iVar27) * iVar48 + iVar31 +
                                           (int)((long)uVar47 / (long)kernel_w) * iVar24));
                      auVar66._8_8_ = 0;
                      auVar66._0_8_ =
                           *(ulong *)((long)bottom_blob->data +
                                     (long)((int)((long)uVar8 % (long)kernel_w) * dilation_w +
                                            (iVar17 / iVar27) * iVar48 + iVar31 +
                                           (int)((long)uVar8 / (long)kernel_w) * iVar24));
                      auVar65 = vpunpcklbw_avx(auVar65,auVar66);
                      *(undefined1 (*) [16])*pauVar36 = auVar65;
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x10);
                    }
                    for (; iVar52 < max_kk; iVar52 = iVar52 + 1) {
                      uVar47 = (long)(iVar56 + iVar52) % (long)iVar27;
                      uVar47 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
                      *(undefined8 *)*pauVar36 =
                           *(undefined8 *)
                            ((long)bottom_blob->data +
                            (long)((int)((long)uVar47 % (long)kernel_w) * dilation_w +
                                   ((iVar56 + iVar52) / iVar27) * iVar48 + iVar31 +
                                  (int)((long)uVar47 / (long)kernel_w) * iVar24));
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 8);
                    }
                  }
                  uVar47 = uVar40;
                  iVar52 = iVar16;
                  if (iVar4 == 8) {
                    while (iVar52 != 0) {
                      iVar17 = (int)uVar47;
                      uVar47 = (ulong)(uint)((int)((long)iVar17 % (long)iVar27) >> 0x1f) << 0x20 |
                               (long)iVar17 % (long)iVar27 & 0xffffffffU;
                      lVar18 = (long)((int)((long)uVar47 % (long)kernel_w) * dilation_w +
                                      (iVar17 / iVar27) * iVar48 + iVar31 +
                                     (int)((long)uVar47 / (long)kernel_w) * iVar24);
                      auVar70 = *(undefined1 (*) [32])((long)bottom_blob->data + lVar18 * 8);
                      auVar115 = *(undefined1 (*) [32])((long)bottom_blob->data + lVar18 * 8 + 0x20)
                      ;
                      auVar114 = vpunpcklwd_avx2(auVar70,auVar115);
                      auVar115 = vpunpckhwd_avx2(auVar70,auVar115);
                      auVar70 = vpmovsxbw_avx2(_DAT_00539690);
                      auVar71 = vpermt2w_avx512vl(auVar114,auVar70,auVar115);
                      auVar70 = vpmovsxbw_avx2(_DAT_005396a0);
                      in_ZMM9 = ZEXT3264(auVar70);
                      auVar70 = vpermt2w_avx512vl(auVar114,auVar70,auVar115);
                      in_ZMM8 = ZEXT3264(auVar70);
                      *(undefined1 (*) [32])*pauVar36 = auVar71;
                      *(undefined1 (*) [32])(*pauVar36 + 0x20) = auVar70;
                      pauVar36 = pauVar36 + 1;
                      uVar47 = (ulong)(iVar17 + 1);
                      iVar52 = iVar52 + -1;
                    }
                  }
                }
                else {
LAB_00198794:
                  auVar70 = vpaddd_avx2(auVar70,auVar115);
                  if (iVar4 == 1) {
                    for (iVar31 = 0; auVar77 = _DAT_00539940, iVar31 + 1 < max_kk;
                        iVar31 = iVar31 + 2) {
                      auVar115 = vpbroadcastd_avx512vl();
                      auVar115 = vpaddd_avx2(auVar115,auVar70);
                      auVar114 = vpbroadcastd_avx512vl();
                      vpaddd_avx2(auVar114,auVar70);
                      auVar114 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
                      auVar114 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar114);
                      auVar115 = vpcmpeqd_avx2(auVar115,auVar115);
                      auVar115 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar115);
                      auVar78 = vinserti64x4_avx512f(ZEXT3264(auVar115),auVar115,1);
                      auVar79 = vinserti64x4_avx512f(ZEXT3264(auVar114),auVar114,1);
                      in_ZMM8 = vpermt2ps_avx512f(auVar79,_DAT_00539940,auVar78);
                      auVar65 = vpmovdb_avx512f(in_ZMM8);
                      *(undefined1 (*) [16])*pauVar36 = auVar65;
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x10);
                      in_ZMM9 = auVar77;
                    }
                    for (; iVar31 < max_kk; iVar31 = iVar31 + 1) {
                      auVar115 = vpbroadcastd_avx512vl();
                      vpaddd_avx2(auVar115,auVar70);
                      auVar115 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
                      auVar115 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar115);
                      in_ZMM9 = ZEXT3264(auVar115);
                      in_ZMM8 = ZEXT3264((undefined1  [32])0x0);
                      auVar65 = vpmovdb_avx512vl(auVar115);
                      *(long *)*pauVar36 = auVar65._0_8_;
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 8);
                    }
                  }
                  iVar31 = iVar16;
                  if (iVar4 == 8) {
                    while (iVar31 != 0) {
                      auVar115 = vpbroadcastd_avx512vl();
                      auVar115 = vpaddd_avx2(auVar115,auVar70);
                      vpslld_avx2(auVar115,3);
                      auVar115 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
                      auVar114 = vpgatherdq(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar115);
                      auVar115 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
                      auVar115 = vpgatherdq(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar115);
                      auVar71 = vpunpcklwd_avx2(auVar114,auVar115);
                      auVar114 = vpunpckhwd_avx2(auVar114,auVar115);
                      in_ZMM8 = ZEXT3264(auVar114);
                      auVar115 = vpmovsxbw_avx2(_DAT_00539690);
                      auVar72 = vpermt2w_avx512vl(auVar71,auVar115,auVar114);
                      in_ZMM9 = ZEXT3264(auVar72);
                      auVar115 = vpmovsxbw_avx2(_DAT_005396a0);
                      auVar115 = vpermt2w_avx512vl(auVar71,auVar115,auVar114);
                      *(undefined1 (*) [32])*pauVar36 = auVar72;
                      *(undefined1 (*) [32])(*pauVar36 + 0x20) = auVar115;
                      pauVar36 = pauVar36 + 1;
                      iVar31 = iVar31 + -1;
                    }
                  }
                }
              }
              auVar110._4_4_ = auVar73._0_4_;
              auVar110._0_4_ = auVar73._0_4_;
              auVar110._8_4_ = auVar73._0_4_;
              auVar110._12_4_ = auVar73._0_4_;
              auVar65 = vpbroadcastd_avx512vl();
              auVar66 = vpbroadcastd_avx512vl();
              for (; (int)(uVar61 | 3) < iVar43; uVar61 = uVar61 + 4) {
                auVar67 = vpbroadcastd_avx512vl();
                auVar67 = vpaddd_avx(auVar67,_DAT_00539290);
                auVar113 = vpmuludq_avx(auVar67,auVar76._0_16_);
                auVar112 = vpsrlq_avx(auVar113,0x20);
                auVar113 = vpsrlq_avx(auVar67,0x20);
                auVar113 = vpmuludq_avx(auVar113,auVar76._0_16_);
                auVar112 = vpblendd_avx2(auVar112,auVar113,10);
                auVar113 = vpsubd_avx(auVar67,auVar112);
                auVar113 = vpsrlvd_avx2(auVar113,auVar110);
                auVar113 = vpaddd_avx(auVar113,auVar112);
                auVar112 = vpsrld_avx(auVar113,ZEXT416(uVar60));
                auVar113 = vpmulld_avx(auVar112,auVar65);
                auVar77 = ZEXT1664(auVar113);
                auVar67 = vpsubd_avx(auVar67,auVar113);
                auVar67 = vpmulld_avx(auVar67,local_78._0_16_);
                auVar113 = vpmulld_avx(auVar112,auVar66);
                auVar67 = vpaddd_avx(auVar67,auVar113);
                if ((stride_w == 1) && (auVar113._0_4_ == auVar113._12_4_)) {
                  iVar31 = auVar67._0_4_;
                  if (iVar4 == 1) {
                    for (iVar52 = 0; iVar52 + 1 < max_kk; iVar52 = iVar52 + 2) {
                      uVar47 = (long)(iVar56 + iVar52) % (long)iVar27;
                      iVar17 = iVar56 + iVar52 + 1;
                      uVar8 = (long)iVar17 % (long)iVar27;
                      uVar47 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
                      uVar8 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
                      auVar67._8_8_ = 0;
                      auVar67._0_8_ =
                           *(ulong *)((long)bottom_blob->data +
                                     (long)((int)((long)uVar47 % (long)kernel_w) * dilation_w +
                                            ((iVar56 + iVar52) / iVar27) * iVar48 + iVar31 +
                                           (int)((long)uVar47 / (long)kernel_w) * iVar24));
                      auVar113._8_8_ = 0;
                      auVar113._0_8_ =
                           *(ulong *)((long)bottom_blob->data +
                                     (long)((int)((long)uVar8 % (long)kernel_w) * dilation_w +
                                            (iVar17 / iVar27) * iVar48 + iVar31 +
                                           (int)((long)uVar8 / (long)kernel_w) * iVar24));
                      auVar67 = vpunpcklbw_avx(auVar67,auVar113);
                      *(long *)*pauVar36 = auVar67._0_8_;
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 8);
                    }
                    for (; iVar52 < max_kk; iVar52 = iVar52 + 1) {
                      uVar47 = (long)(iVar56 + iVar52) % (long)iVar27;
                      uVar47 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
                      lVar18 = (long)((int)((long)uVar47 % (long)kernel_w) * dilation_w +
                                      ((iVar56 + iVar52) / iVar27) * iVar48 + iVar31 +
                                     (int)((long)uVar47 / (long)kernel_w) * iVar24);
                      (*pauVar36)[0] = *(undefined1 *)((long)bottom_blob->data + lVar18);
                      (*pauVar36)[1] = *(undefined1 *)((long)bottom_blob->data + lVar18 + 1);
                      (*pauVar36)[2] = *(undefined1 *)((long)bottom_blob->data + lVar18 + 2);
                      (*pauVar36)[3] = *(undefined1 *)((long)bottom_blob->data + lVar18 + 3);
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 4);
                    }
                  }
                  uVar47 = uVar40;
                  iVar52 = iVar16;
                  if (iVar4 == 8) {
                    while (iVar52 != 0) {
                      iVar17 = (int)uVar47;
                      uVar47 = (ulong)(uint)((int)((long)iVar17 % (long)iVar27) >> 0x1f) << 0x20 |
                               (long)iVar17 % (long)iVar27 & 0xffffffffU;
                      lVar18 = (long)((int)((long)uVar47 % (long)kernel_w) * dilation_w +
                                      (iVar17 / iVar27) * iVar48 + iVar31 +
                                     (int)((long)uVar47 / (long)kernel_w) * iVar24);
                      auVar67 = *(undefined1 (*) [16])((long)bottom_blob->data + lVar18 * 8);
                      auVar113 = *(undefined1 (*) [16])((long)bottom_blob->data + lVar18 * 8 + 0x10)
                      ;
                      auVar112 = vpunpcklwd_avx(auVar67,auVar113);
                      auVar67 = vpunpckhwd_avx(auVar67,auVar113);
                      auVar113 = vpunpcklwd_avx(auVar112,auVar67);
                      auVar67 = vpunpckhwd_avx(auVar112,auVar67);
                      *(undefined1 (*) [16])*pauVar36 = auVar113;
                      *(undefined1 (*) [16])(*pauVar36 + 0x10) = auVar67;
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x20);
                      uVar47 = (ulong)(iVar17 + 1);
                      iVar52 = iVar52 + -1;
                    }
                  }
                }
                else {
                  if (iVar4 == 1) {
                    for (iVar31 = 0; iVar31 + 1 < max_kk; iVar31 = iVar31 + 2) {
                      auVar113 = vpbroadcastd_avx512vl();
                      vpaddd_avx(auVar113,auVar67);
                      auVar113 = vpbroadcastd_avx512vl();
                      vpaddd_avx(auVar113,auVar67);
                      auVar113 = vpcmpeqd_avx(in_ZMM9._0_16_,in_ZMM9._0_16_);
                      auVar112 = vpgatherdd((undefined1  [16])0x0,auVar113);
                      auVar113 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                      auVar113 = vpgatherdd((undefined1  [16])0x0,auVar113);
                      in_ZMM9 = ZEXT1664((undefined1  [16])0x0);
                      auVar73 = vpmovsxbd_avx2(ZEXT816(0xb030a0209010800));
                      auVar77 = ZEXT3264(auVar73);
                      auVar73 = vpermt2d_avx512vl(ZEXT1632(auVar112),auVar73,ZEXT1632(auVar113));
                      in_ZMM8 = ZEXT3264(auVar73);
                      auVar113 = vpmovdb_avx512vl(auVar73);
                      *(long *)*pauVar36 = auVar113._0_8_;
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 8);
                    }
                    for (; iVar31 < max_kk; iVar31 = iVar31 + 1) {
                      auVar113 = vpbroadcastd_avx512vl();
                      vpaddd_avx(auVar113,auVar67);
                      auVar113 = vpcmpeqd_avx(in_ZMM8._0_16_,in_ZMM8._0_16_);
                      auVar113 = vpgatherdd((undefined1  [16])0x0,auVar113);
                      auVar77 = ZEXT1664(auVar113);
                      in_ZMM8 = ZEXT1664((undefined1  [16])0x0);
                      auVar113 = vpmovdb_avx512vl(auVar113);
                      *(int *)*pauVar36 = auVar113._0_4_;
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 4);
                    }
                  }
                  iVar31 = iVar16;
                  if (iVar4 == 8) {
                    while (iVar31 != 0) {
                      auVar113 = vpbroadcastd_avx512vl();
                      auVar113 = vpaddd_avx(auVar113,auVar67);
                      vpslld_avx(auVar113,3);
                      auVar73 = vpcmpeqd_avx2(auVar77._0_32_,auVar77._0_32_);
                      auVar68 = vpgatherdq(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar73);
                      in_ZMM8 = ZEXT3264(auVar68);
                      auVar77 = ZEXT3264((undefined1  [32])0x0);
                      auVar73 = vpmovsxbw_avx2(_DAT_005396b0);
                      auVar73 = vpermw_avx512vl(auVar73,auVar68);
                      *(undefined1 (*) [32])*pauVar36 = auVar73;
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x20);
                      iVar31 = iVar31 + -1;
                    }
                  }
                }
              }
              for (; (int)(uVar61 | 1) < iVar43; uVar61 = uVar61 + 2) {
                iVar31 = uVar61 + iVar37 + 1;
                iVar44 = ((int)(uVar61 + iVar37) / iVar38) * iVar25;
                iVar52 = (iVar31 / iVar38) * iVar25;
                iVar17 = ((int)(uVar61 + iVar37) % iVar38) * stride_w + iVar44;
                if ((stride_w == 1) && (iVar44 == iVar52)) {
                  if (iVar4 == 1) {
                    for (iVar31 = 0; iVar31 + 1 < max_kk; iVar31 = iVar31 + 2) {
                      uVar47 = (long)(iVar56 + iVar31) % (long)iVar27;
                      iVar52 = iVar56 + iVar31 + 1;
                      uVar8 = (long)iVar52 % (long)iVar27;
                      uVar47 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
                      uVar8 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
                      pvVar21 = bottom_blob->data;
                      lVar19 = (long)((int)((long)uVar47 % (long)kernel_w) * dilation_w +
                                      ((iVar56 + iVar31) / iVar27) * iVar48 + iVar17 +
                                     (int)((long)uVar47 / (long)kernel_w) * iVar24);
                      lVar18 = (long)((int)((long)uVar8 % (long)kernel_w) * dilation_w +
                                      (iVar52 / iVar27) * iVar48 + iVar17 +
                                     (int)((long)uVar8 / (long)kernel_w) * iVar24);
                      (*pauVar36)[0] = *(undefined1 *)((long)pvVar21 + lVar19);
                      (*pauVar36)[1] = *(undefined1 *)((long)pvVar21 + lVar18);
                      (*pauVar36)[2] = *(undefined1 *)((long)pvVar21 + lVar19 + 1);
                      (*pauVar36)[3] = *(undefined1 *)((long)pvVar21 + lVar18 + 1);
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 4);
                    }
                    for (; iVar31 < max_kk; iVar31 = iVar31 + 1) {
                      uVar47 = (long)(iVar56 + iVar31) % (long)iVar27;
                      uVar47 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
                      pvVar21 = bottom_blob->data;
                      lVar18 = (long)((int)((long)uVar47 % (long)kernel_w) * dilation_w +
                                      ((iVar56 + iVar31) / iVar27) * iVar48 + iVar17 +
                                     (int)((long)uVar47 / (long)kernel_w) * iVar24);
                      (*pauVar36)[0] = *(undefined1 *)((long)pvVar21 + lVar18);
                      (*pauVar36)[1] = *(undefined1 *)((long)pvVar21 + lVar18 + 1);
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 2);
                    }
                  }
                  uVar47 = uVar40;
                  iVar31 = iVar16;
                  if (iVar4 == 8) {
                    while (iVar31 != 0) {
                      iVar52 = (int)uVar47;
                      uVar47 = (ulong)(uint)((int)((long)iVar52 % (long)iVar27) >> 0x1f) << 0x20 |
                               (long)iVar52 % (long)iVar27 & 0xffffffffU;
                      auVar65 = vpshufb_avx(*(undefined1 (*) [16])
                                             ((long)bottom_blob->data +
                                             (long)((int)((long)uVar47 % (long)kernel_w) *
                                                    dilation_w + (iVar52 / iVar27) * iVar48 + iVar17
                                                   + (int)((long)uVar47 / (long)kernel_w) * iVar24)
                                             * 8),_DAT_00539660);
                      *(undefined1 (*) [16])*pauVar36 = auVar65;
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x10);
                      uVar47 = (ulong)(iVar52 + 1);
                      iVar31 = iVar31 + -1;
                    }
                  }
                }
                else {
                  iVar52 = (iVar31 % iVar38) * stride_w + iVar52;
                  iVar31 = 0;
                  if (iVar4 == 1) {
                    for (iVar31 = 0; iVar31 + 1 < max_kk; iVar31 = iVar31 + 2) {
                      uVar47 = (long)(iVar56 + iVar31) % (long)iVar27;
                      iVar44 = iVar56 + iVar31 + 1;
                      uVar8 = (long)iVar44 % (long)iVar27;
                      uVar47 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
                      iVar45 = (int)((long)uVar47 % (long)kernel_w) * dilation_w +
                               ((iVar56 + iVar31) / iVar27) * iVar48 +
                               (int)((long)uVar47 / (long)kernel_w) * iVar24;
                      uVar47 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
                      iVar44 = (int)((long)uVar47 % (long)kernel_w) * dilation_w +
                               (iVar44 / iVar27) * iVar48 +
                               (int)((long)uVar47 / (long)kernel_w) * iVar24;
                      pvVar21 = bottom_blob->data;
                      (*pauVar36)[0] = *(undefined1 *)((long)pvVar21 + (long)(iVar45 + iVar17));
                      (*pauVar36)[1] = *(undefined1 *)((long)pvVar21 + (long)(iVar44 + iVar17));
                      (*pauVar36)[2] = *(undefined1 *)((long)pvVar21 + (long)(iVar45 + iVar52));
                      (*pauVar36)[3] = *(undefined1 *)((long)pvVar21 + (long)(iVar44 + iVar52));
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 4);
                    }
                    for (; iVar31 < max_kk; iVar31 = iVar31 + 1) {
                      uVar47 = (long)(iVar56 + iVar31) % (long)iVar27;
                      uVar47 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
                      iVar44 = (int)((long)uVar47 % (long)kernel_w) * dilation_w +
                               ((iVar56 + iVar31) / iVar27) * iVar48 +
                               (int)((long)uVar47 / (long)kernel_w) * iVar24;
                      pvVar21 = bottom_blob->data;
                      (*pauVar36)[0] = *(undefined1 *)((long)pvVar21 + (long)(iVar44 + iVar17));
                      (*pauVar36)[1] = *(undefined1 *)((long)pvVar21 + (long)(iVar44 + iVar52));
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 2);
                    }
                  }
                  if (iVar4 == 8) {
                    for (; iVar31 < iVar30; iVar31 = iVar31 + 1) {
                      iVar44 = (int)((long)iVar56 / 8) + iVar31;
                      uVar47 = (long)iVar44 % (long)iVar27;
                      uVar47 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
                      iVar44 = (int)((long)uVar47 % (long)kernel_w) * dilation_w +
                               (iVar44 / iVar27) * iVar48 +
                               (int)((long)uVar47 / (long)kernel_w) * iVar24;
                      auVar112._8_8_ = 0;
                      auVar112._0_8_ =
                           *(ulong *)((long)bottom_blob->data + (long)(iVar44 + iVar17) * 8);
                      auVar109._8_8_ = 0;
                      auVar109._0_8_ =
                           *(ulong *)((long)bottom_blob->data + (long)(iVar44 + iVar52) * 8);
                      auVar65 = vpunpcklwd_avx(auVar112,auVar109);
                      *(undefined1 (*) [16])*pauVar36 = auVar65;
                      pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x10);
                    }
                  }
                }
              }
              for (; (int)uVar61 < iVar43; uVar61 = uVar61 + 1) {
                iVar30 = ((int)(iVar37 + uVar61) / iVar38) * iVar25 +
                         ((int)(iVar37 + uVar61) % iVar38) * stride_w;
                if (iVar4 == 1) {
                  for (lVar18 = 0; iVar31 = (int)lVar18, iVar31 + 1 < max_kk; lVar18 = lVar18 + 2) {
                    uVar47 = (long)(iVar56 + iVar31) % (long)iVar27;
                    iVar52 = iVar56 + iVar31 + 1;
                    uVar8 = (long)iVar52 % (long)iVar27;
                    uVar47 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
                    uVar8 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
                    pvVar21 = bottom_blob->data;
                    (*pauVar36)[lVar18] =
                         *(undefined1 *)
                          ((long)pvVar21 +
                          (long)((int)((long)uVar47 % (long)kernel_w) * dilation_w +
                                 ((iVar56 + iVar31) / iVar27) * iVar48 + iVar30 +
                                (int)((long)uVar47 / (long)kernel_w) * iVar24));
                    (*pauVar36)[lVar18 + 1] =
                         *(undefined1 *)
                          ((long)pvVar21 +
                          (long)((int)((long)uVar8 % (long)kernel_w) * dilation_w +
                                 (iVar52 / iVar27) * iVar48 + iVar30 +
                                (int)((long)uVar8 / (long)kernel_w) * iVar24));
                  }
                  for (; (int)lVar18 < max_kk; lVar18 = lVar18 + 1) {
                    iVar31 = iVar56 + (int)lVar18;
                    uVar47 = (long)iVar31 % (long)iVar27;
                    uVar47 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
                    (*pauVar36)[lVar18] =
                         *(undefined1 *)
                          ((long)bottom_blob->data +
                          (long)((int)((long)uVar47 % (long)kernel_w) * dilation_w +
                                 (iVar31 / iVar27) * iVar48 + iVar30 +
                                (int)((long)uVar47 / (long)kernel_w) * iVar24));
                  }
                  pauVar36 = (undefined1 (*) [64])(*pauVar36 + lVar18);
                }
                uVar47 = uVar40;
                iVar31 = iVar16;
                if (iVar4 == 8) {
                  while (iVar31 != 0) {
                    iVar52 = (int)uVar47;
                    uVar47 = (ulong)(uint)((int)((long)iVar52 % (long)iVar27) >> 0x1f) << 0x20 |
                             (long)iVar52 % (long)iVar27 & 0xffffffffU;
                    *(undefined8 *)*pauVar36 =
                         *(undefined8 *)
                          ((long)bottom_blob->data +
                          (long)((int)((long)uVar47 % (long)kernel_w) * dilation_w +
                                 (iVar52 / iVar27) * iVar48 + iVar30 +
                                (int)((long)uVar47 / (long)kernel_w) * iVar24) * 8);
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + 8);
                    uVar47 = (ulong)(iVar52 + 1);
                    iVar31 = iVar31 + -1;
                  }
                }
              }
            }
            else {
              iVar4 = bottom_blob->elempack;
              lVar18 = (long)(iVar56 / 8);
              iVar24 = max_kk / 8;
              lVar28 = (long)(iVar48 * 8);
              lVar19 = (long)iVar56;
              lVar46 = (long)iVar48;
              lVar62 = (long)(iVar48 * 2);
              if (iVar24 < 1) {
                iVar24 = 0;
              }
              local_218 = (long)iVar37;
              lVar20 = (long)iVar43;
              local_250 = local_218 * 8 + 0x40;
              lVar57 = local_218 + lVar46;
              local_2c0 = (iVar48 + 3) + local_218;
              local_2a0 = (iVar48 + 2) + local_218;
              lVar32 = (iVar48 + 1) + local_218;
              local_298 = local_218 * 8 + 0x10;
              lVar54 = local_218 * 8 + 8;
              pauVar36 = (undefined1 (*) [64])local_208.data;
              lVar49 = local_218;
              for (uVar40 = 0; (long)(uVar40 | 0xf) < lVar20; uVar40 = uVar40 + 0x10) {
                if (iVar4 == 8) {
                  pauVar33 = (undefined1 (*) [16])
                             (bottom_blob->cstep * lVar18 * bottom_blob->elemsize + local_250 +
                             (long)bottom_blob->data);
                  iVar48 = iVar24;
                  while (bVar64 = iVar48 != 0, iVar48 = iVar48 + -1, bVar64) {
                    auVar113 = vpunpcklwd_avx(pauVar33[-4],pauVar33[-3]);
                    auVar65 = vpunpckhwd_avx(pauVar33[-4],pauVar33[-3]);
                    auVar112 = vpunpcklwd_avx(pauVar33[-2],pauVar33[-1]);
                    auVar66 = vpunpckhwd_avx(pauVar33[-2],pauVar33[-1]);
                    auVar109 = vpunpcklwd_avx(*pauVar33,pauVar33[1]);
                    auVar110 = vpunpckhwd_avx(*pauVar33,pauVar33[1]);
                    auVar105 = vpunpcklwd_avx(pauVar33[2],pauVar33[3]);
                    auVar67 = vpunpckhwd_avx(pauVar33[2],pauVar33[3]);
                    auVar107 = vpunpcklwd_avx(auVar113,auVar65);
                    auVar65 = vpunpckhwd_avx(auVar113,auVar65);
                    auVar113 = vpunpcklwd_avx(auVar112,auVar66);
                    auVar66 = vpunpckhwd_avx(auVar112,auVar66);
                    auVar112 = vpunpcklwd_avx(auVar109,auVar110);
                    auVar110 = vpunpckhwd_avx(auVar109,auVar110);
                    auVar109 = vpunpcklwd_avx(auVar105,auVar67);
                    auVar67 = vpunpckhwd_avx(auVar105,auVar67);
                    auVar105 = vpunpcklqdq_avx(auVar107,auVar113);
                    auVar106 = vpunpcklqdq_avx(auVar112,auVar109);
                    in_ZMM9 = ZEXT1664(auVar106);
                    auVar113 = vpunpckhqdq_avx(auVar107,auVar113);
                    auVar112 = vpunpckhqdq_avx(auVar112,auVar109);
                    auVar109 = vpunpcklqdq_avx(auVar65,auVar66);
                    auVar107 = vpunpcklqdq_avx(auVar110,auVar67);
                    in_ZMM8 = ZEXT1664(auVar107);
                    auVar65 = vpunpckhqdq_avx(auVar65,auVar66);
                    auVar66 = vpunpckhqdq_avx(auVar110,auVar67);
                    *(undefined1 (*) [16])*pauVar36 = auVar105;
                    *(undefined1 (*) [16])(*pauVar36 + 0x10) = auVar106;
                    *(undefined1 (*) [16])(*pauVar36 + 0x20) = auVar113;
                    *(undefined1 (*) [16])(*pauVar36 + 0x30) = auVar112;
                    *(undefined1 (*) [16])pauVar36[1] = auVar109;
                    *(undefined1 (*) [16])(pauVar36[1] + 0x10) = auVar107;
                    *(undefined1 (*) [16])(pauVar36[1] + 0x20) = auVar65;
                    *(undefined1 (*) [16])(pauVar36[1] + 0x30) = auVar66;
                    pauVar36 = pauVar36 + 2;
                    pauVar33 = (undefined1 (*) [16])(*pauVar33 + lVar28);
                  }
                }
                if (iVar4 == 1) {
                  lVar39 = bottom_blob->cstep * lVar19 * bottom_blob->elemsize;
                  lVar34 = (long)bottom_blob->data + lVar49;
                  lVar53 = (long)bottom_blob->data + lVar57;
                  for (iVar48 = 0; iVar48 + 1 < max_kk; iVar48 = iVar48 + 2) {
                    auVar66 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar34 + lVar39),
                                             *(undefined1 (*) [16])(lVar53 + lVar39));
                    auVar65 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar34 + lVar39),
                                             *(undefined1 (*) [16])(lVar53 + lVar39));
                    *(undefined1 (*) [16])*pauVar36 = auVar66;
                    *(undefined1 (*) [16])(*pauVar36 + 0x10) = auVar65;
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x20);
                    lVar34 = lVar34 + lVar62;
                    lVar53 = lVar53 + lVar62;
                  }
                  pauVar33 = (undefined1 (*) [16])(lVar34 + lVar39);
                  for (; iVar48 < max_kk; iVar48 = iVar48 + 1) {
                    *(undefined1 (*) [16])*pauVar36 = *pauVar33;
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x10);
                    pauVar33 = (undefined1 (*) [16])(*pauVar33 + lVar46);
                  }
                }
                local_250 = local_250 + 0x80;
                lVar49 = lVar49 + 0x10;
                lVar57 = lVar57 + 0x10;
                local_298 = local_298 + 0x80;
                local_2c0 = local_2c0 + 0x10;
                local_2a0 = local_2a0 + 0x10;
                lVar32 = lVar32 + 0x10;
                lVar54 = lVar54 + 0x80;
              }
              for (; (long)(uVar40 | 7) < lVar20; uVar40 = uVar40 + 8) {
                if (iVar4 == 8) {
                  pauVar33 = (undefined1 (*) [16])
                             ((long)bottom_blob->data +
                             (local_218 + uVar40) * 8 +
                             bottom_blob->cstep * lVar18 * bottom_blob->elemsize);
                  iVar48 = iVar24;
                  while (bVar64 = iVar48 != 0, iVar48 = iVar48 + -1, bVar64) {
                    auVar110 = vpunpcklwd_avx(*pauVar33,pauVar33[1]);
                    auVar65 = vpunpckhwd_avx(*pauVar33,pauVar33[1]);
                    auVar67 = vpunpcklwd_avx(pauVar33[2],pauVar33[3]);
                    auVar66 = vpunpckhwd_avx(pauVar33[2],pauVar33[3]);
                    auVar113 = vpunpcklwd_avx(auVar110,auVar65);
                    auVar65 = vpunpckhwd_avx(auVar110,auVar65);
                    auVar110 = vpunpcklwd_avx(auVar67,auVar66);
                    auVar66 = vpunpckhwd_avx(auVar67,auVar66);
                    auVar67 = vpunpcklqdq_avx(auVar113,auVar110);
                    auVar110 = vpunpckhqdq_avx(auVar113,auVar110);
                    auVar113 = vpunpcklqdq_avx(auVar65,auVar66);
                    auVar65 = vpunpckhqdq_avx(auVar65,auVar66);
                    *(undefined1 (*) [16])*pauVar36 = auVar67;
                    *(undefined1 (*) [16])(*pauVar36 + 0x10) = auVar110;
                    *(undefined1 (*) [16])(*pauVar36 + 0x20) = auVar113;
                    *(undefined1 (*) [16])(*pauVar36 + 0x30) = auVar65;
                    pauVar36 = pauVar36 + 1;
                    pauVar33 = (undefined1 (*) [16])(*pauVar33 + lVar28);
                  }
                }
                if (iVar4 == 1) {
                  pvVar21 = (void *)(bottom_blob->cstep * lVar19 * bottom_blob->elemsize +
                                    (long)bottom_blob->data);
                  for (iVar48 = 0; iVar48 + 1 < max_kk; iVar48 = iVar48 + 2) {
                    auVar105._8_8_ = 0;
                    auVar105._0_8_ = *(ulong *)((long)pvVar21 + lVar49);
                    auVar107._8_8_ = 0;
                    auVar107._0_8_ = *(ulong *)((long)pvVar21 + lVar57);
                    auVar65 = vpunpcklbw_avx(auVar105,auVar107);
                    *(undefined1 (*) [16])*pauVar36 = auVar65;
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x10);
                    pvVar21 = (void *)((long)pvVar21 + lVar62);
                  }
                  puVar22 = (undefined8 *)((long)pvVar21 + lVar49);
                  for (; iVar48 < max_kk; iVar48 = iVar48 + 1) {
                    *(undefined8 *)*pauVar36 = *puVar22;
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + 8);
                    puVar22 = (undefined8 *)((long)puVar22 + lVar46);
                  }
                }
                lVar49 = lVar49 + 8;
                lVar57 = lVar57 + 8;
                local_298 = local_298 + 0x40;
                local_2c0 = local_2c0 + 8;
                local_2a0 = local_2a0 + 8;
                lVar32 = lVar32 + 8;
                lVar54 = lVar54 + 0x40;
              }
              for (; (long)(uVar40 | 3) < lVar20; uVar40 = uVar40 + 4) {
                if (iVar4 == 8) {
                  lVar34 = bottom_blob->cstep * lVar18 * bottom_blob->elemsize;
                  lVar39 = (long)bottom_blob->data + local_298;
                  iVar48 = iVar24;
                  while (bVar64 = iVar48 != 0, iVar48 = iVar48 + -1, bVar64) {
                    auVar65 = *(undefined1 (*) [16])(lVar39 + -0x10 + lVar34);
                    auVar66 = *(undefined1 (*) [16])(lVar39 + lVar34);
                    auVar110 = vpunpcklwd_avx(auVar65,auVar66);
                    auVar65 = vpunpckhwd_avx(auVar65,auVar66);
                    auVar66 = vpunpcklwd_avx(auVar110,auVar65);
                    auVar65 = vpunpckhwd_avx(auVar110,auVar65);
                    *(undefined1 (*) [16])*pauVar36 = auVar66;
                    *(undefined1 (*) [16])(*pauVar36 + 0x10) = auVar65;
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x20);
                    lVar39 = lVar39 + lVar28;
                  }
                }
                if (iVar4 == 1) {
                  pvVar21 = bottom_blob->data;
                  lVar41 = bottom_blob->cstep * lVar19 * bottom_blob->elemsize;
                  lVar34 = (long)pvVar21 + lVar49;
                  lVar26 = local_2c0 + (long)pvVar21;
                  lVar39 = (long)pvVar21 + local_2a0;
                  lVar53 = (long)pvVar21 + lVar32;
                  lVar55 = (long)pvVar21 + lVar57;
                  for (iVar48 = 1; iVar48 < max_kk; iVar48 = iVar48 + 2) {
                    (*pauVar36)[0] = *(undefined1 *)(lVar34 + lVar41);
                    (*pauVar36)[1] = *(undefined1 *)(lVar55 + lVar41);
                    (*pauVar36)[2] = *(undefined1 *)(lVar34 + 1 + lVar41);
                    (*pauVar36)[3] = *(undefined1 *)(lVar53 + lVar41);
                    (*pauVar36)[4] = *(undefined1 *)(lVar34 + 2 + lVar41);
                    (*pauVar36)[5] = *(undefined1 *)(lVar39 + lVar41);
                    (*pauVar36)[6] = *(undefined1 *)(lVar34 + 3 + lVar41);
                    (*pauVar36)[7] = *(undefined1 *)(lVar26 + lVar41);
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + 8);
                    lVar34 = lVar34 + lVar62;
                    lVar26 = lVar26 + lVar62;
                    lVar39 = lVar39 + lVar62;
                    lVar53 = lVar53 + lVar62;
                    lVar55 = lVar55 + lVar62;
                  }
                  puVar23 = (undefined1 *)(lVar34 + lVar41);
                  for (iVar48 = iVar48 + -1; local_250 = uVar40, iVar48 < max_kk;
                      iVar48 = iVar48 + 1) {
                    (*pauVar36)[0] = *puVar23;
                    (*pauVar36)[1] = puVar23[1];
                    (*pauVar36)[2] = puVar23[2];
                    (*pauVar36)[3] = puVar23[3];
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + 4);
                    puVar23 = puVar23 + lVar46;
                  }
                }
                local_298 = local_298 + 0x20;
                lVar49 = lVar49 + 4;
                local_2c0 = local_2c0 + 4;
                local_2a0 = local_2a0 + 4;
                lVar32 = lVar32 + 4;
                lVar57 = lVar57 + 4;
                lVar54 = lVar54 + 0x20;
              }
              for (; (long)(uVar40 | 1) < lVar20; uVar40 = uVar40 + 2) {
                if (iVar4 == 8) {
                  lVar34 = bottom_blob->cstep * lVar18 * bottom_blob->elemsize;
                  lVar39 = (long)bottom_blob->data + lVar54;
                  iVar48 = iVar24;
                  while (bVar64 = iVar48 != 0, iVar48 = iVar48 + -1, bVar64) {
                    auVar106._8_8_ = 0;
                    auVar106._0_8_ = *(ulong *)(lVar39 + -8 + lVar34);
                    auVar108._8_8_ = 0;
                    auVar108._0_8_ = *(ulong *)(lVar39 + lVar34);
                    auVar65 = vpunpcklwd_avx(auVar106,auVar108);
                    *(undefined1 (*) [16])*pauVar36 = auVar65;
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x10);
                    lVar39 = lVar39 + lVar28;
                  }
                }
                if (iVar4 == 1) {
                  pvVar21 = bottom_blob->data;
                  lVar53 = bottom_blob->cstep * lVar19 * bottom_blob->elemsize;
                  lVar34 = (long)pvVar21 + lVar49;
                  lVar39 = (long)pvVar21 + lVar32;
                  lVar26 = (long)pvVar21 + lVar57;
                  for (iVar48 = 0; iVar48 + 1 < max_kk; iVar48 = iVar48 + 2) {
                    (*pauVar36)[0] = *(undefined1 *)(lVar34 + lVar53);
                    (*pauVar36)[1] = *(undefined1 *)(lVar26 + lVar53);
                    (*pauVar36)[2] = *(undefined1 *)(lVar34 + 1 + lVar53);
                    (*pauVar36)[3] = *(undefined1 *)(lVar39 + lVar53);
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + 4);
                    lVar34 = lVar34 + lVar62;
                    lVar39 = lVar39 + lVar62;
                    lVar26 = lVar26 + lVar62;
                  }
                  for (; local_250 = uVar40, iVar48 < max_kk; iVar48 = iVar48 + 1) {
                    (*pauVar36)[0] = *(undefined1 *)(lVar34 + lVar53);
                    (*pauVar36)[1] = *(undefined1 *)(lVar34 + 1 + lVar53);
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + 2);
                    lVar53 = lVar53 + lVar46;
                  }
                }
                lVar54 = lVar54 + 0x10;
                lVar49 = lVar49 + 2;
                lVar32 = lVar32 + 2;
                lVar57 = lVar57 + 2;
              }
              if (max_kk < 1) {
                max_kk = 0;
              }
              for (; (long)uVar40 < lVar20; uVar40 = uVar40 + 1) {
                if (iVar4 == 8) {
                  puVar22 = (undefined8 *)
                            ((long)bottom_blob->data +
                            (uVar40 + local_218) * 8 +
                            bottom_blob->cstep * lVar18 * bottom_blob->elemsize);
                  iVar48 = iVar24;
                  while (bVar64 = iVar48 != 0, iVar48 = iVar48 + -1, bVar64) {
                    *(undefined8 *)*pauVar36 = *puVar22;
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + 8);
                    puVar22 = (undefined8 *)((long)puVar22 + lVar28);
                  }
                }
                if (iVar4 == 1) {
                  puVar23 = (undefined1 *)
                            ((long)bottom_blob->data +
                            local_218 + uVar40 + bottom_blob->cstep * lVar19 * bottom_blob->elemsize
                            );
                  iVar48 = max_kk;
                  while (bVar64 = iVar48 != 0, iVar48 = iVar48 + -1, bVar64) {
                    (*pauVar36)[0] = *puVar23;
                    pauVar36 = (undefined1 (*) [64])(*pauVar36 + 1);
                    puVar23 = puVar23 + lVar46;
                  }
                }
              }
            }
          }
          else {
            convolution_im2col_input_tile_int8_avxvnni
                      (bottom_blob,&local_208,iVar37,iVar43,iVar56,max_kk,kernel_w,(int)local_230,
                       dilation_w,dilation_h,stride_w,stride_h);
          }
        }
        else {
          convolution_im2col_input_tile_int8_avxvnniint8
                    (bottom_blob,&local_208,iVar37,iVar43,iVar56,max_kk,kernel_w,(int)local_230,
                     dilation_w,dilation_h,stride_w,stride_h);
        }
      }
      else {
        convolution_im2col_input_tile_int8_avx512vnni
                  (bottom_blob,&local_208,iVar37,iVar43,iVar56,max_kk,kernel_w,(int)local_230,
                   dilation_w,dilation_h,stride_w,stride_h);
      }
      pMVar58 = local_1c0;
      piVar14 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_208.allocator == (Allocator *)0x0) {
            in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            free(local_208.data);
          }
          else {
            in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            (*(local_208.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar48 = (int)local_210 + 1;
    }
    local_208.cstep = 0;
    local_208.data = (void *)0x0;
    local_208.refcount._0_4_ = 0;
    local_208.refcount._4_4_ = 0;
    local_208.elemsize = 0;
    local_208.elempack = 0;
    local_208.allocator = (Allocator *)0x0;
    local_208.dims = 0;
    local_208.w = 0;
    local_208.h = 0;
    local_208.d = 0;
    local_208.c = 0;
    Mat::create(&local_208,TILE_M * TILE_N,1,nT,4,opt->workspace_allocator);
    local_220 = 0xffffffffffffff9c;
    if ((local_208.data != (void *)0x0) && ((long)local_208.c * local_208.cstep != 0)) {
      local_220 = 0;
      if (local_244 < 1) {
        local_244 = 0;
      }
      for (iVar15 = 0; iVar15 != local_244; iVar15 = iVar15 + 1) {
        iVar48 = TILE_M * iVar15;
        iVar27 = M - iVar48;
        if (TILE_M < M - iVar48) {
          iVar27 = TILE_M;
        }
        iVar43 = get_omp_thread_num();
        m.data = (void *)((long)iVar43 * local_208.cstep * local_208.elemsize + (long)local_208.data
                         );
        m.refcount = (int *)0x0;
        m.elemsize = local_208.elemsize;
        m.elempack = local_208.elempack;
        m.allocator = local_208.allocator;
        m.w = local_208.w;
        m.h = local_208.h;
        m.d = 1;
        m.c = local_208.d;
        m.dims = local_208.dims + -1;
        m.cstep = (local_208.elemsize * (long)local_208.h * (long)local_208.w + 0xf &
                  0xfffffffffffffff0) / local_208.elemsize;
        if (local_208.dims == 4) {
          m.cstep = (long)local_208.h * (long)local_208.w;
        }
        lVar18 = (long)iVar48;
        lVar19 = (long)iVar27;
        local_230 = lVar18 * 4;
        local_218 = lVar18 * 4 + 4;
        auVar76 = vpmovsxbd_avx512f(_DAT_005396c0);
        auVar77 = vpmovsxbd_avx512f(_DAT_005396d0);
        auVar78 = vpmovsxbq_avx512f(ZEXT816(0xd0c050409080100));
        auVar79 = vpmovsxbq_avx512f(ZEXT816(0xf0e07060b0a0302));
        iVar43 = 0;
        local_240 = iVar15;
        while (iVar37 = iVar43, iVar15 = local_240, iVar43 = (int)local_1b8 - iVar37,
              iVar43 != 0 && iVar37 <= (int)local_1b8) {
          if (TILE_N < iVar43) {
            iVar43 = TILE_N;
          }
          iVar15 = 0;
          while (iVar56 = (int)local_1b0 - iVar15, iVar56 != 0 && iVar15 <= (int)local_1b0) {
            if (TILE_K < iVar56) {
              iVar56 = TILE_K;
            }
            local_c0.w = pMVar58->w;
            local_c0.cstep = (size_t)local_c0.w;
            local_c0.elemsize = pMVar58->elemsize;
            local_c0.elempack = pMVar58->elempack;
            local_c0.allocator = pMVar58->allocator;
            local_c0.data =
                 (void *)((long)pMVar58->data +
                         local_c0.elemsize * local_c0.cstep * (long)(iVar15 / TILE_K) +
                         (long)(iVar48 / TILE_M) * pMVar58->cstep * local_c0.elemsize);
            local_c0.refcount = (int *)0x0;
            local_108.dims = 2;
            local_c0.h = 1;
            local_c0.d = 1;
            local_108.c = 1;
            local_108.cstep = (size_t)local_1a8.w;
            local_108.data =
                 (void *)((long)local_1a8.data +
                         local_1a8.elemsize * local_108.cstep * (long)(iVar15 / TILE_K) +
                         (long)(iVar37 / TILE_N) * local_1a8.cstep * local_1a8.elemsize);
            local_108.refcount = (int *)0x0;
            local_108.elemsize = local_1a8.elemsize;
            local_108.elempack = local_1a8.elempack;
            local_108.allocator = local_1a8.allocator;
            local_108.w = local_1a8.w;
            local_108.h = 1;
            local_108.d = 1;
            local_c0.dims = local_108.dims;
            local_c0.c = local_108.c;
            Gemm_x86_avx512_utility::gemm_transB_packed_tile_int8
                      (&local_c0,&local_108,&m,iVar48,iVar27,iVar37,iVar43,iVar15,iVar56);
            if (local_108.refcount != (int *)0x0) {
              LOCK();
              *local_108.refcount = *local_108.refcount + -1;
              UNLOCK();
              if (*local_108.refcount == 0) {
                if (local_108.allocator == (Allocator *)0x0) {
                  free(local_108.data);
                }
                else {
                  (*(local_108.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            if (local_c0.refcount != (int *)0x0) {
              LOCK();
              *local_c0.refcount = *local_c0.refcount + -1;
              UNLOCK();
              if (*local_c0.refcount == 0) {
                if (local_c0.allocator == (Allocator *)0x0) {
                  free(local_c0.data);
                }
                else {
                  (*(local_c0.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            iVar15 = iVar15 + TILE_K;
            auVar76 = vpmovsxbd_avx512f(_DAT_005396c0);
            auVar77 = vpmovsxbd_avx512f(_DAT_005396d0);
            auVar78 = vpmovsxbq_avx512f(ZEXT816(0xd0c050409080100));
            auVar79 = vpmovsxbq_avx512f(ZEXT816(0xf0e07060b0a0302));
          }
          iVar15 = local_228->elempack;
          sVar7 = local_228->cstep;
          lVar28 = (long)(iVar15 * iVar37);
          iVar56 = (int)sVar7;
          lVar46 = (long)iVar56;
          lVar59 = (long)(iVar56 * 2);
          lVar62 = (long)(sVar7 * 0x300000000) >> 0x20;
          lVar57 = (long)(iVar56 * 4);
          lVar54 = (long)(sVar7 * 0x500000000) >> 0x20;
          lVar55 = (long)(sVar7 * 0x600000000) >> 0x20;
          lVar63 = (long)(sVar7 * 0x700000000) >> 0x20;
          lVar41 = (long)(iVar56 * 8);
          lVar49 = (long)(sVar7 * 0x900000000) >> 0x20;
          lVar20 = (long)(sVar7 * 0xa00000000) >> 0x20;
          lVar32 = (long)(sVar7 * 0xb00000000) >> 0x20;
          lVar34 = (long)(sVar7 * 0xc00000000) >> 0x20;
          lVar53 = (long)(sVar7 * 0xd00000000) >> 0x20;
          lVar26 = (long)(sVar7 * 0xe00000000) >> 0x20;
          lVar39 = (long)(sVar7 * 0xf00000000) >> 0x20;
          auVar80 = vpbroadcastd_avx512f();
          auVar80 = vpmulld_avx512f(auVar80,_DAT_00539980);
          local_210 = (long)iVar37;
          local_298 = local_230 * lVar46 + local_210 * 4;
          local_250 = lVar46 * 0x40;
          local_278 = local_218 * lVar46 + local_210 * 4;
          local_260 = local_218 * lVar46 + local_210 * 4 + 0x10;
          local_78._0_8_ = local_298;
          local_298 = local_298 + (long)(iVar56 + 1) * 4;
          pauVar36 = (undefined1 (*) [64])m.data;
          for (uVar40 = 0; (long)(uVar40 | 0xf) < lVar19; uVar40 = uVar40 + 0x10) {
            pauVar29 = (undefined1 (*) [64])
                       ((long)local_228->data + lVar28 * 4 + (lVar18 + uVar40) * lVar46 * 4);
            for (iVar56 = 0; iVar56 + 0xf < iVar43; iVar56 = iVar56 + 0x10) {
              auVar81 = vmovdqa64_avx512f(*pauVar36);
              auVar82 = vmovdqa64_avx512f(pauVar36[2]);
              auVar83 = vmovdqa64_avx512f(pauVar36[4]);
              auVar84 = vmovdqa64_avx512f(pauVar36[6]);
              auVar85 = vmovdqa64_avx512f(pauVar36[8]);
              auVar86 = vmovdqa64_avx512f(pauVar36[10]);
              auVar87 = vmovdqa64_avx512f(pauVar36[0xc]);
              auVar88 = vpshufd_avx512f(pauVar36[1],0x93);
              auVar89 = vpshufd_avx512f(pauVar36[3],0x93);
              auVar90 = vpshufd_avx512f(pauVar36[5],0x93);
              auVar91 = vpshufd_avx512f(pauVar36[7],0x93);
              auVar92 = vpshufd_avx512f(pauVar36[9],0x93);
              auVar93 = vpshufd_avx512f(pauVar36[0xb],0x93);
              auVar94 = vpshufd_avx512f(pauVar36[0xd],0x93);
              auVar95 = vmovdqa64_avx512f(pauVar36[0xe]);
              auVar96 = vpshufd_avx512f(pauVar36[0xf],0x93);
              auVar97 = vpunpckldq_avx512f(auVar81,auVar89);
              auVar81 = vpunpckhdq_avx512f(auVar81,auVar89);
              auVar89 = vpunpckldq_avx512f(auVar82,auVar88);
              auVar82 = vpunpckhdq_avx512f(auVar82,auVar88);
              auVar88 = vpunpckldq_avx512f(auVar83,auVar91);
              auVar83 = vpunpckhdq_avx512f(auVar83,auVar91);
              auVar91 = vpunpckldq_avx512f(auVar84,auVar90);
              auVar84 = vpunpckhdq_avx512f(auVar84,auVar90);
              auVar90 = vpunpckldq_avx512f(auVar85,auVar93);
              auVar85 = vpunpckhdq_avx512f(auVar85,auVar93);
              auVar93 = vpunpckldq_avx512f(auVar86,auVar92);
              auVar86 = vpunpckhdq_avx512f(auVar86,auVar92);
              auVar92 = vpunpckldq_avx512f(auVar87,auVar96);
              auVar87 = vpunpckhdq_avx512f(auVar87,auVar96);
              auVar96 = vpunpckldq_avx512f(auVar95,auVar94);
              auVar94 = vpunpckhdq_avx512f(auVar95,auVar94);
              auVar95 = vpunpcklqdq_avx512f(auVar97,auVar89);
              auVar98 = vpunpcklqdq_avx512f(auVar82,auVar81);
              auVar99 = vpunpcklqdq_avx512f(auVar88,auVar91);
              auVar100 = vpunpcklqdq_avx512f(auVar84,auVar83);
              auVar101 = vpunpcklqdq_avx512f(auVar90,auVar93);
              auVar102 = vpunpcklqdq_avx512f(auVar86,auVar85);
              auVar103 = vpunpcklqdq_avx512f(auVar92,auVar96);
              auVar104 = vpunpcklqdq_avx512f(auVar94,auVar87);
              auVar89 = vpermt2d_avx512f(auVar89,auVar76,auVar97);
              auVar81 = vpermt2d_avx512f(auVar81,auVar76,auVar82);
              auVar82 = vpermt2d_avx512f(auVar91,auVar76,auVar88);
              auVar83 = vpermt2d_avx512f(auVar83,auVar76,auVar84);
              auVar84 = vpermt2d_avx512f(auVar93,auVar76,auVar90);
              auVar85 = vpermt2d_avx512f(auVar85,auVar76,auVar86);
              auVar86 = vpermt2d_avx512f(auVar96,auVar76,auVar92);
              auVar87 = vpermt2d_avx512f(auVar87,auVar76,auVar94);
              auVar88 = vshufi64x2_avx512f(auVar95,auVar101,0x88);
              auVar90 = vshufi64x2_avx512f(auVar89,auVar84,0x88);
              auVar91 = vshufi64x2_avx512f(auVar98,auVar102,0x88);
              auVar92 = vshufi64x2_avx512f(auVar81,auVar85,0x88);
              auVar93 = vshufi64x2_avx512f(auVar101,auVar95,0xdd);
              auVar84 = vshufi64x2_avx512f(auVar84,auVar89,0xdd);
              auVar89 = vshufi64x2_avx512f(auVar102,auVar98,0xdd);
              auVar81 = vshufi64x2_avx512f(auVar85,auVar81,0xdd);
              auVar85 = vshufi64x2_avx512f(auVar99,auVar103,0x88);
              auVar94 = vshufi64x2_avx512f(auVar82,auVar86,0x88);
              auVar95 = vshufi64x2_avx512f(auVar100,auVar104,0x88);
              auVar96 = vshufi64x2_avx512f(auVar83,auVar87,0x88);
              auVar97 = vshufi64x2_avx512f(auVar103,auVar99,0xdd);
              auVar82 = vshufi64x2_avx512f(auVar86,auVar82,0xdd);
              auVar86 = vshufi64x2_avx512f(auVar104,auVar100,0xdd);
              auVar83 = vshufi64x2_avx512f(auVar87,auVar83,0xdd);
              auVar87 = vshufi64x2_avx512f(auVar88,auVar85,0xd8);
              auVar98 = vshufi64x2_avx512f(auVar90,auVar94,0xd8);
              auVar99 = vshufi64x2_avx512f(auVar91,auVar95,0xd8);
              auVar100 = vshufi64x2_avx512f(auVar92,auVar96,0xd8);
              auVar101 = vshufi64x2_avx512f(auVar93,auVar97,0xd8);
              auVar102 = vshufi64x2_avx512f(auVar84,auVar82,0xd8);
              auVar103 = vshufi64x2_avx512f(auVar89,auVar86,0xd8);
              auVar104 = vshufi64x2_avx512f(auVar81,auVar83,0xd8);
              auVar85 = vshufi64x2_avx512f(auVar85,auVar88,0xd8);
              auVar88 = vshufi64x2_avx512f(auVar94,auVar90,0xd8);
              auVar90 = vshufi64x2_avx512f(auVar95,auVar91,0xd8);
              auVar91 = vshufi64x2_avx512f(auVar96,auVar92,0xd8);
              auVar92 = vshufi64x2_avx512f(auVar97,auVar93,0xd8);
              auVar82 = vshufi64x2_avx512f(auVar82,auVar84,0xd8);
              auVar84 = vshufi64x2_avx512f(auVar86,auVar89,0xd8);
              auVar81 = vshufi64x2_avx512f(auVar83,auVar81,0xd8);
              if (iVar15 == 1) {
                auVar83 = vpunpckldq_avx512f(auVar87,auVar98);
                auVar86 = vpunpckhdq_avx512f(auVar87,auVar98);
                auVar87 = vpunpckldq_avx512f(auVar99,auVar100);
                auVar89 = vpunpckhdq_avx512f(auVar99,auVar100);
                auVar93 = vpunpckldq_avx512f(auVar101,auVar102);
                auVar94 = vpunpckhdq_avx512f(auVar101,auVar102);
                auVar95 = vpunpckldq_avx512f(auVar103,auVar104);
                auVar96 = vpunpckhdq_avx512f(auVar103,auVar104);
                auVar97 = vpunpckldq_avx512f(auVar85,auVar88);
                auVar85 = vpunpckhdq_avx512f(auVar85,auVar88);
                auVar88 = vpunpckldq_avx512f(auVar90,auVar91);
                auVar90 = vpunpckhdq_avx512f(auVar90,auVar91);
                auVar91 = vpunpckldq_avx512f(auVar92,auVar82);
                auVar82 = vpunpckhdq_avx512f(auVar92,auVar82);
                auVar92 = vpunpckldq_avx512f(auVar84,auVar81);
                auVar81 = vpunpckhdq_avx512f(auVar84,auVar81);
                auVar84 = vpunpckhqdq_avx512f(auVar83,auVar87);
                auVar98 = vpunpckhqdq_avx512f(auVar86,auVar89);
                auVar99 = vpunpckhqdq_avx512f(auVar93,auVar95);
                auVar100 = vpunpckhqdq_avx512f(auVar94,auVar96);
                auVar101 = vpunpckhqdq_avx512f(auVar97,auVar88);
                auVar102 = vpunpckhqdq_avx512f(auVar85,auVar90);
                auVar103 = vpunpckhqdq_avx512f(auVar91,auVar92);
                auVar104 = vpunpckhqdq_avx512f(auVar82,auVar81);
                auVar83 = vpunpcklqdq_avx512f(auVar83,auVar87);
                auVar87 = vpunpcklqdq_avx512f(auVar93,auVar95);
                auVar93 = vshufi64x2_avx512f(auVar83,auVar87,0x88);
                auVar88 = vpunpcklqdq_avx512f(auVar97,auVar88);
                auVar91 = vpunpcklqdq_avx512f(auVar91,auVar92);
                auVar92 = vshufi64x2_avx512f(auVar88,auVar91,0x88);
                auVar95 = vshufi64x2_avx512f(auVar84,auVar99,0x88);
                auVar97 = vshufi64x2_avx512f(auVar101,auVar103,0x88);
                auVar86 = vpunpcklqdq_avx512f(auVar86,auVar89);
                auVar89 = vpunpcklqdq_avx512f(auVar94,auVar96);
                auVar94 = vshufi64x2_avx512f(auVar86,auVar89,0x88);
                auVar85 = vpunpcklqdq_avx512f(auVar85,auVar90);
                auVar81 = vpunpcklqdq_avx512f(auVar82,auVar81);
                auVar82 = vshufi64x2_avx512f(auVar85,auVar81,0x88);
                auVar90 = vshufi64x2_avx512f(auVar98,auVar100,0x88);
                auVar96 = vshufi64x2_avx512f(auVar102,auVar104,0x88);
                auVar83 = vshufi64x2_avx512f(auVar83,auVar87,0xdd);
                auVar87 = vshufi64x2_avx512f(auVar88,auVar91,0xdd);
                auVar84 = vshufi64x2_avx512f(auVar84,auVar99,0xdd);
                auVar88 = vshufi64x2_avx512f(auVar101,auVar103,0xdd);
                auVar86 = vshufi64x2_avx512f(auVar86,auVar89,0xdd);
                auVar81 = vshufi64x2_avx512f(auVar85,auVar81,0xdd);
                auVar85 = vshufi64x2_avx512f(auVar98,auVar100,0xdd);
                auVar89 = vshufi64x2_avx512f(auVar102,auVar104,0xdd);
                auVar91 = vshufi64x2_avx512f(auVar93,auVar92,0x88);
                auVar98 = vshufi64x2_avx512f(auVar95,auVar97,0x88);
                auVar99 = vshufi64x2_avx512f(auVar94,auVar82,0x88);
                auVar100 = vshufi64x2_avx512f(auVar90,auVar96,0x88);
                auVar101 = vshufi64x2_avx512f(auVar83,auVar87,0x88);
                auVar102 = vshufi64x2_avx512f(auVar84,auVar88,0x88);
                auVar103 = vshufi64x2_avx512f(auVar86,auVar81,0x88);
                auVar104 = vshufi64x2_avx512f(auVar85,auVar89,0x88);
                auVar92 = vshufi64x2_avx512f(auVar93,auVar92,0xdd);
                auVar93 = vshufi64x2_avx512f(auVar95,auVar97,0xdd);
                auVar82 = vshufi64x2_avx512f(auVar94,auVar82,0xdd);
                auVar90 = vshufi64x2_avx512f(auVar90,auVar96,0xdd);
                auVar83 = vshufi64x2_avx512f(auVar83,auVar87,0xdd);
                auVar84 = vshufi64x2_avx512f(auVar84,auVar88,0xdd);
                auVar86 = vshufi64x2_avx512f(auVar86,auVar81,0xdd);
                auVar85 = vshufi64x2_avx512f(auVar85,auVar89,0xdd);
                auVar81 = vmovdqu64_avx512f(auVar91);
                *pauVar29 = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar98);
                *(undefined1 (*) [64])(*pauVar29 + lVar46 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar99);
                *(undefined1 (*) [64])(*pauVar29 + lVar59 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar100);
                *(undefined1 (*) [64])(*pauVar29 + lVar62 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar101);
                *(undefined1 (*) [64])(*pauVar29 + lVar57 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar102);
                *(undefined1 (*) [64])(*pauVar29 + lVar54 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar103);
                *(undefined1 (*) [64])(*pauVar29 + lVar55 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar104);
                *(undefined1 (*) [64])(*pauVar29 + lVar63 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar92);
                *(undefined1 (*) [64])(*pauVar29 + lVar41 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar93);
                *(undefined1 (*) [64])(*pauVar29 + lVar49 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar82);
                *(undefined1 (*) [64])(*pauVar29 + lVar20 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar90);
                *(undefined1 (*) [64])(*pauVar29 + lVar32 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar83);
                *(undefined1 (*) [64])(*pauVar29 + lVar34 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar84);
                *(undefined1 (*) [64])(*pauVar29 + lVar53 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar86);
                *(undefined1 (*) [64])(*pauVar29 + lVar26 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar85);
                *(undefined1 (*) [64])(*pauVar29 + lVar39 * 4) = auVar81;
                pauVar29 = pauVar29 + 1;
              }
              else if (iVar15 == 4) {
                auVar83 = vshufi64x2_avx512f(auVar87,auVar98,0x88);
                auVar86 = vshufi64x2_avx512f(auVar99,auVar100,0x88);
                auVar89 = vshufi64x2_avx512f(auVar101,auVar102,0x88);
                auVar93 = vshufi64x2_avx512f(auVar103,auVar104,0x88);
                auVar94 = vshufi64x2_avx512f(auVar85,auVar88,0x88);
                auVar95 = vshufi64x2_avx512f(auVar90,auVar91,0x88);
                auVar96 = vshufi64x2_avx512f(auVar92,auVar82,0x88);
                auVar97 = vshufi64x2_avx512f(auVar84,auVar81,0x88);
                auVar87 = vshufi64x2_avx512f(auVar87,auVar98,0xdd);
                auVar98 = vshufi64x2_avx512f(auVar99,auVar100,0xdd);
                auVar99 = vshufi64x2_avx512f(auVar101,auVar102,0xdd);
                auVar100 = vshufi64x2_avx512f(auVar103,auVar104,0xdd);
                auVar85 = vshufi64x2_avx512f(auVar85,auVar88,0xdd);
                auVar88 = vshufi64x2_avx512f(auVar90,auVar91,0xdd);
                auVar82 = vshufi64x2_avx512f(auVar92,auVar82,0xdd);
                auVar81 = vshufi64x2_avx512f(auVar84,auVar81,0xdd);
                auVar84 = vshufi64x2_avx512f(auVar83,auVar86,0x88);
                auVar90 = vshufi64x2_avx512f(auVar89,auVar93,0x88);
                auVar91 = vshufi64x2_avx512f(auVar94,auVar95,0x88);
                auVar92 = vshufi64x2_avx512f(auVar96,auVar97,0x88);
                auVar101 = vshufi64x2_avx512f(auVar87,auVar98,0x88);
                auVar102 = vshufi64x2_avx512f(auVar99,auVar100,0x88);
                auVar103 = vshufi64x2_avx512f(auVar85,auVar88,0x88);
                auVar104 = vshufi64x2_avx512f(auVar82,auVar81,0x88);
                auVar83 = vshufi64x2_avx512f(auVar83,auVar86,0xdd);
                auVar86 = vshufi64x2_avx512f(auVar89,auVar93,0xdd);
                auVar89 = vshufi64x2_avx512f(auVar94,auVar95,0xdd);
                auVar93 = vshufi64x2_avx512f(auVar96,auVar97,0xdd);
                auVar87 = vshufi64x2_avx512f(auVar87,auVar98,0xdd);
                auVar94 = vshufi64x2_avx512f(auVar99,auVar100,0xdd);
                auVar85 = vshufi64x2_avx512f(auVar85,auVar88,0xdd);
                auVar82 = vshufi64x2_avx512f(auVar82,auVar81,0xdd);
                auVar81 = vmovdqu64_avx512f(auVar84);
                *pauVar29 = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar90);
                pauVar29[1] = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar91);
                pauVar29[2] = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar92);
                pauVar29[3] = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar101);
                *(undefined1 (*) [64])(*pauVar29 + lVar57 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar102);
                *(undefined1 (*) [64])(pauVar29[1] + lVar57 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar103);
                *(undefined1 (*) [64])(pauVar29[2] + lVar57 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar104);
                *(undefined1 (*) [64])(pauVar29[3] + lVar57 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar83);
                *(undefined1 (*) [64])(*pauVar29 + lVar41 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar86);
                *(undefined1 (*) [64])(pauVar29[1] + lVar41 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar89);
                *(undefined1 (*) [64])(pauVar29[2] + lVar41 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar93);
                *(undefined1 (*) [64])(pauVar29[3] + lVar41 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar87);
                *(undefined1 (*) [64])(*pauVar29 + lVar34 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar94);
                *(undefined1 (*) [64])(pauVar29[1] + lVar34 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar85);
                *(undefined1 (*) [64])(pauVar29[2] + lVar34 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar82);
                *(undefined1 (*) [64])(pauVar29[3] + lVar34 * 4) = auVar81;
                pauVar29 = pauVar29 + 4;
              }
              else if (iVar15 == 8) {
                auVar83 = vinserti64x4_avx512f(auVar87,auVar98._0_32_,1);
                auVar83 = vmovdqu64_avx512f(auVar83);
                *pauVar29 = auVar83;
                auVar83 = vinserti64x4_avx512f(auVar99,auVar100._0_32_,1);
                auVar83 = vmovdqu64_avx512f(auVar83);
                pauVar29[1] = auVar83;
                auVar83 = vinserti64x4_avx512f(auVar101,auVar102._0_32_,1);
                auVar83 = vmovdqu64_avx512f(auVar83);
                pauVar29[2] = auVar83;
                auVar83 = vinserti64x4_avx512f(auVar103,auVar104._0_32_,1);
                auVar83 = vmovdqu64_avx512f(auVar83);
                pauVar29[3] = auVar83;
                auVar83 = vinserti64x4_avx512f(auVar85,auVar88._0_32_,1);
                auVar83 = vmovdqu64_avx512f(auVar83);
                pauVar29[4] = auVar83;
                auVar83 = vinserti64x4_avx512f(auVar90,auVar91._0_32_,1);
                auVar83 = vmovdqu64_avx512f(auVar83);
                pauVar29[5] = auVar83;
                auVar83 = vinserti64x4_avx512f(auVar92,auVar82._0_32_,1);
                auVar83 = vmovdqu64_avx512f(auVar83);
                pauVar29[6] = auVar83;
                auVar83 = vinserti64x4_avx512f(auVar84,auVar81._0_32_,1);
                auVar83 = vmovdqu64_avx512f(auVar83);
                pauVar29[7] = auVar83;
                auVar83 = vshufi64x2_avx512f(auVar87,auVar98,0xee);
                auVar83 = vmovdqu64_avx512f(auVar83);
                *(undefined1 (*) [64])(*pauVar29 + lVar41 * 4) = auVar83;
                auVar83 = vshufi64x2_avx512f(auVar99,auVar100,0xee);
                auVar83 = vmovdqu64_avx512f(auVar83);
                *(undefined1 (*) [64])(pauVar29[1] + lVar41 * 4) = auVar83;
                auVar83 = vshufi64x2_avx512f(auVar101,auVar102,0xee);
                auVar83 = vmovdqu64_avx512f(auVar83);
                *(undefined1 (*) [64])(pauVar29[2] + lVar41 * 4) = auVar83;
                auVar83 = vshufi64x2_avx512f(auVar103,auVar104,0xee);
                auVar83 = vmovdqu64_avx512f(auVar83);
                *(undefined1 (*) [64])(pauVar29[3] + lVar41 * 4) = auVar83;
                auVar83 = vshufi64x2_avx512f(auVar85,auVar88,0xee);
                auVar83 = vmovdqu64_avx512f(auVar83);
                *(undefined1 (*) [64])(pauVar29[4] + lVar41 * 4) = auVar83;
                auVar83 = vshufi64x2_avx512f(auVar90,auVar91,0xee);
                auVar83 = vmovdqu64_avx512f(auVar83);
                *(undefined1 (*) [64])(pauVar29[5] + lVar41 * 4) = auVar83;
                auVar82 = vshufi64x2_avx512f(auVar92,auVar82,0xee);
                auVar82 = vmovdqu64_avx512f(auVar82);
                *(undefined1 (*) [64])(pauVar29[6] + lVar41 * 4) = auVar82;
                auVar81 = vshufi64x2_avx512f(auVar84,auVar81,0xee);
                auVar81 = vmovdqu64_avx512f(auVar81);
                *(undefined1 (*) [64])(pauVar29[7] + lVar41 * 4) = auVar81;
                pauVar29 = pauVar29 + 8;
              }
              else if (iVar15 == 0x10) {
                auVar83 = vmovdqa64_avx512f(auVar87);
                *pauVar29 = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar98);
                pauVar29[1] = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar99);
                pauVar29[2] = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar100);
                pauVar29[3] = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar101);
                pauVar29[4] = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar102);
                pauVar29[5] = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar103);
                pauVar29[6] = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar104);
                pauVar29[7] = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar85);
                pauVar29[8] = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar88);
                pauVar29[9] = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar90);
                pauVar29[10] = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar91);
                pauVar29[0xb] = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar92);
                pauVar29[0xc] = auVar83;
                auVar82 = vmovdqa64_avx512f(auVar82);
                pauVar29[0xd] = auVar82;
                auVar82 = vmovdqa64_avx512f(auVar84);
                pauVar29[0xe] = auVar82;
                auVar81 = vmovdqa64_avx512f(auVar81);
                pauVar29[0xf] = auVar81;
                pauVar29 = pauVar29 + 0x10;
              }
              pauVar36 = pauVar36 + 0x10;
            }
            for (; iVar56 + 7 < iVar43; iVar56 = iVar56 + 8) {
              auVar81 = vmovdqa64_avx512f(*pauVar36);
              auVar82 = vmovdqa64_avx512f(pauVar36[2]);
              auVar83 = vmovdqa64_avx512f(pauVar36[4]);
              auVar84 = vpshufd_avx512f(pauVar36[1],0x93);
              auVar85 = vpshufd_avx512f(pauVar36[3],0x93);
              auVar86 = vpshufd_avx512f(pauVar36[5],0x93);
              auVar87 = vmovdqa64_avx512f(pauVar36[6]);
              auVar88 = vpshufd_avx512f(pauVar36[7],0x93);
              auVar89 = vpunpckldq_avx512f(auVar81,auVar85);
              auVar81 = vpunpckhdq_avx512f(auVar81,auVar85);
              auVar85 = vpunpckldq_avx512f(auVar82,auVar84);
              auVar82 = vpunpckhdq_avx512f(auVar82,auVar84);
              auVar84 = vpunpckldq_avx512f(auVar83,auVar88);
              auVar83 = vpunpckhdq_avx512f(auVar83,auVar88);
              auVar88 = vpunpckldq_avx512f(auVar87,auVar86);
              auVar86 = vpunpckhdq_avx512f(auVar87,auVar86);
              auVar87 = vpunpcklqdq_avx512f(auVar89,auVar85);
              auVar90 = vpunpcklqdq_avx512f(auVar82,auVar81);
              auVar91 = vpunpcklqdq_avx512f(auVar84,auVar88);
              auVar92 = vpunpcklqdq_avx512f(auVar86,auVar83);
              auVar85 = vpermt2d_avx512f(auVar85,auVar76,auVar89);
              auVar81 = vpermt2d_avx512f(auVar81,auVar76,auVar82);
              auVar82 = vpermt2d_avx512f(auVar88,auVar76,auVar84);
              auVar83 = vpermt2d_avx512f(auVar83,auVar76,auVar86);
              auVar84 = vshufi64x2_avx512f(auVar87,auVar91,0x14);
              auVar86 = vshufi64x2_avx512f(auVar85,auVar82,0x14);
              auVar88 = vshufi64x2_avx512f(auVar90,auVar92,0x14);
              auVar89 = vshufi64x2_avx512f(auVar81,auVar83,0x14);
              auVar87 = vshufi64x2_avx512f(auVar87,auVar91,0xbe);
              auVar82 = vshufi64x2_avx512f(auVar85,auVar82,0xbe);
              auVar85 = vshufi64x2_avx512f(auVar90,auVar92,0xbe);
              auVar81 = vshufi64x2_avx512f(auVar81,auVar83,0xbe);
              auVar83 = vshufi64x2_avx512f(auVar84,auVar87,0x88);
              auVar90 = vshufi64x2_avx512f(auVar86,auVar82,0x88);
              auVar91 = vshufi64x2_avx512f(auVar88,auVar85,0x88);
              auVar92 = vshufi64x2_avx512f(auVar89,auVar81,0x88);
              auVar84 = vshufi64x2_avx512f(auVar84,auVar87,0x77);
              auVar82 = vshufi64x2_avx512f(auVar86,auVar82,0x77);
              auVar85 = vshufi64x2_avx512f(auVar88,auVar85,0x77);
              auVar81 = vshufi64x2_avx512f(auVar89,auVar81,0x77);
              if (iVar15 == 1) {
                auVar86 = vpunpckldq_avx512f(auVar83,auVar90);
                auVar83 = vpunpckhdq_avx512f(auVar83,auVar90);
                auVar87 = vpunpckldq_avx512f(auVar91,auVar92);
                auVar88 = vpunpckhdq_avx512f(auVar91,auVar92);
                auVar89 = vpunpckldq_avx512f(auVar84,auVar82);
                auVar82 = vpunpckhdq_avx512f(auVar84,auVar82);
                auVar84 = vpunpckldq_avx512f(auVar85,auVar81);
                auVar81 = vpunpckhdq_avx512f(auVar85,auVar81);
                auVar85 = vpunpckhqdq_avx512f(auVar86,auVar87);
                auVar90 = vpunpckhqdq_avx512f(auVar83,auVar88);
                auVar91 = vpunpckhqdq_avx512f(auVar89,auVar84);
                auVar92 = vpunpckhqdq_avx512f(auVar82,auVar81);
                auVar86 = vpunpcklqdq_avx512f(auVar86,auVar87);
                auVar84 = vpunpcklqdq_avx512f(auVar89,auVar84);
                auVar87 = vshufi64x2_avx512f(auVar86,auVar84,0x88);
                auVar89 = vshufi64x2_avx512f(auVar85,auVar91,0x88);
                auVar83 = vpunpcklqdq_avx512f(auVar83,auVar88);
                auVar81 = vpunpcklqdq_avx512f(auVar82,auVar81);
                auVar82 = vshufi64x2_avx512f(auVar83,auVar81,0x88);
                auVar88 = vshufi64x2_avx512f(auVar90,auVar92,0x88);
                auVar84 = vshufi64x2_avx512f(auVar86,auVar84,0xdd);
                auVar85 = vshufi64x2_avx512f(auVar85,auVar91,0xdd);
                auVar81 = vshufi64x2_avx512f(auVar83,auVar81,0xdd);
                auVar83 = vshufi64x2_avx512f(auVar90,auVar92,0xdd);
                auVar86 = vshufi64x2_avx512f(auVar87,auVar89,0x88);
                auVar90 = vshufi64x2_avx512f(auVar82,auVar88,0x88);
                auVar91 = vshufi64x2_avx512f(auVar84,auVar85,0x88);
                auVar92 = vshufi64x2_avx512f(auVar81,auVar83,0x88);
                auVar87 = vshufi64x2_avx512f(auVar87,auVar89,0xdd);
                auVar82 = vshufi64x2_avx512f(auVar82,auVar88,0xdd);
                auVar84 = vshufi64x2_avx512f(auVar84,auVar85,0xdd);
                auVar81 = vshufi64x2_avx512f(auVar81,auVar83,0xdd);
                *(undefined1 (*) [32])*pauVar29 = auVar86._0_32_;
                auVar73 = vextracti64x4_avx512f(auVar86,1);
                *(undefined1 (*) [32])(*pauVar29 + lVar46 * 4) = auVar73;
                *(undefined1 (*) [32])(*pauVar29 + lVar59 * 4) = auVar90._0_32_;
                auVar73 = vextracti64x4_avx512f(auVar90,1);
                *(undefined1 (*) [32])(*pauVar29 + lVar62 * 4) = auVar73;
                *(undefined1 (*) [32])(*pauVar29 + lVar57 * 4) = auVar91._0_32_;
                auVar73 = vextracti64x4_avx512f(auVar91,1);
                *(undefined1 (*) [32])(*pauVar29 + lVar54 * 4) = auVar73;
                *(undefined1 (*) [32])(*pauVar29 + lVar55 * 4) = auVar92._0_32_;
                auVar73 = vextracti64x4_avx512f(auVar92,1);
                *(undefined1 (*) [32])(*pauVar29 + lVar63 * 4) = auVar73;
                *(undefined1 (*) [32])(*pauVar29 + lVar41 * 4) = auVar87._0_32_;
                auVar73 = vextracti64x4_avx512f(auVar87,1);
                *(undefined1 (*) [32])(*pauVar29 + lVar49 * 4) = auVar73;
                *(undefined1 (*) [32])(*pauVar29 + lVar20 * 4) = auVar82._0_32_;
                auVar73 = vextracti64x4_avx512f(auVar82,1);
                *(undefined1 (*) [32])(*pauVar29 + lVar32 * 4) = auVar73;
                *(undefined1 (*) [32])(*pauVar29 + lVar34 * 4) = auVar84._0_32_;
                auVar73 = vextracti64x4_avx512f(auVar84,1);
                *(undefined1 (*) [32])(*pauVar29 + lVar53 * 4) = auVar73;
                *(undefined1 (*) [32])(*pauVar29 + lVar26 * 4) = auVar81._0_32_;
                auVar73 = vextracti64x4_avx512f(auVar81,1);
                *(undefined1 (*) [32])(*pauVar29 + lVar39 * 4) = auVar73;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
              }
              else if (iVar15 == 4) {
                auVar86 = vshufi64x2_avx512f(auVar83,auVar90,0x88);
                auVar87 = vshufi64x2_avx512f(auVar91,auVar92,0x88);
                auVar88 = vshufi64x2_avx512f(auVar84,auVar82,0x88);
                auVar89 = vshufi64x2_avx512f(auVar85,auVar81,0x88);
                auVar83 = vshufi64x2_avx512f(auVar83,auVar90,0xdd);
                auVar90 = vshufi64x2_avx512f(auVar91,auVar92,0xdd);
                auVar82 = vshufi64x2_avx512f(auVar84,auVar82,0xdd);
                auVar81 = vshufi64x2_avx512f(auVar85,auVar81,0xdd);
                auVar84 = vshufi64x2_avx512f(auVar86,auVar87,0x88);
                auVar85 = vshufi64x2_avx512f(auVar88,auVar89,0x88);
                auVar91 = vshufi64x2_avx512f(auVar83,auVar90,0x88);
                auVar92 = vshufi64x2_avx512f(auVar82,auVar81,0x88);
                auVar86 = vshufi64x2_avx512f(auVar86,auVar87,0xdd);
                auVar87 = vshufi64x2_avx512f(auVar88,auVar89,0xdd);
                auVar83 = vshufi64x2_avx512f(auVar83,auVar90,0xdd);
                auVar82 = vshufi64x2_avx512f(auVar82,auVar81,0xdd);
                auVar81 = vmovdqu64_avx512f(auVar84);
                *pauVar29 = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar85);
                pauVar29[1] = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar91);
                *(undefined1 (*) [64])(*pauVar29 + lVar57 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar92);
                *(undefined1 (*) [64])(pauVar29[1] + lVar57 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar86);
                *(undefined1 (*) [64])(*pauVar29 + lVar41 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar87);
                *(undefined1 (*) [64])(pauVar29[1] + lVar41 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar83);
                *(undefined1 (*) [64])(*pauVar29 + lVar34 * 4) = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar82);
                *(undefined1 (*) [64])(pauVar29[1] + lVar34 * 4) = auVar81;
                pauVar29 = pauVar29 + 2;
              }
              else if (iVar15 == 8) {
                auVar86 = vinserti64x4_avx512f(auVar83,auVar90._0_32_,1);
                auVar86 = vmovdqu64_avx512f(auVar86);
                *pauVar29 = auVar86;
                auVar86 = vinserti64x4_avx512f(auVar91,auVar92._0_32_,1);
                auVar86 = vmovdqu64_avx512f(auVar86);
                pauVar29[1] = auVar86;
                auVar86 = vinserti64x4_avx512f(auVar84,auVar82._0_32_,1);
                auVar86 = vmovdqu64_avx512f(auVar86);
                pauVar29[2] = auVar86;
                auVar86 = vinserti64x4_avx512f(auVar85,auVar81._0_32_,1);
                auVar86 = vmovdqu64_avx512f(auVar86);
                pauVar29[3] = auVar86;
                auVar83 = vshufi64x2_avx512f(auVar83,auVar90,0xee);
                auVar83 = vmovdqu64_avx512f(auVar83);
                *(undefined1 (*) [64])(*pauVar29 + lVar41 * 4) = auVar83;
                auVar83 = vshufi64x2_avx512f(auVar91,auVar92,0xee);
                auVar83 = vmovdqu64_avx512f(auVar83);
                *(undefined1 (*) [64])(pauVar29[1] + lVar41 * 4) = auVar83;
                auVar82 = vshufi64x2_avx512f(auVar84,auVar82,0xee);
                auVar82 = vmovdqu64_avx512f(auVar82);
                *(undefined1 (*) [64])(pauVar29[2] + lVar41 * 4) = auVar82;
                auVar81 = vshufi64x2_avx512f(auVar85,auVar81,0xee);
                auVar81 = vmovdqu64_avx512f(auVar81);
                *(undefined1 (*) [64])(pauVar29[3] + lVar41 * 4) = auVar81;
                pauVar29 = pauVar29 + 4;
              }
              else if (iVar15 == 0x10) {
                auVar83 = vmovdqa64_avx512f(auVar83);
                *pauVar29 = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar90);
                pauVar29[1] = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar91);
                pauVar29[2] = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar92);
                pauVar29[3] = auVar83;
                auVar83 = vmovdqa64_avx512f(auVar84);
                pauVar29[4] = auVar83;
                auVar82 = vmovdqa64_avx512f(auVar82);
                pauVar29[5] = auVar82;
                auVar82 = vmovdqa64_avx512f(auVar85);
                pauVar29[6] = auVar82;
                auVar81 = vmovdqa64_avx512f(auVar81);
                pauVar29[7] = auVar81;
                pauVar29 = pauVar29 + 8;
              }
              pauVar36 = pauVar36 + 8;
            }
            for (; iVar56 + 3 < iVar43; iVar56 = iVar56 + 4) {
              auVar81 = vmovdqa64_avx512f(*pauVar36);
              auVar82 = vpshufd_avx512f(pauVar36[1],0x93);
              auVar83 = vmovdqa64_avx512f(pauVar36[2]);
              auVar84 = vpshufd_avx512f(pauVar36[3],0x93);
              auVar85 = vpunpckldq_avx512f(auVar81,auVar84);
              auVar81 = vpunpckhdq_avx512f(auVar81,auVar84);
              auVar84 = vpunpckldq_avx512f(auVar83,auVar82);
              auVar82 = vpunpckhdq_avx512f(auVar83,auVar82);
              auVar83 = vpunpcklqdq_avx512f(auVar85,auVar84);
              auVar86 = vpunpcklqdq_avx512f(auVar82,auVar81);
              auVar84 = vpermt2d_avx512f(auVar84,auVar76,auVar85);
              auVar81 = vpermt2d_avx512f(auVar81,auVar76,auVar82);
              if (iVar15 == 1) {
                auVar82 = vpunpckldq_avx512f(auVar83,auVar84);
                auVar83 = vpunpckhdq_avx512f(auVar83,auVar84);
                auVar84 = vpunpckldq_avx512f(auVar86,auVar81);
                auVar81 = vpunpckhdq_avx512f(auVar86,auVar81);
                auVar85 = vpunpckhqdq_avx512f(auVar82,auVar84);
                auVar86 = vpunpckhqdq_avx512f(auVar83,auVar81);
                auVar82 = vpunpcklqdq_avx512f(auVar82,auVar84);
                auVar81 = vpunpcklqdq_avx512f(auVar83,auVar81);
                *(undefined1 (*) [16])*pauVar29 = auVar82._0_16_;
                *(undefined1 (*) [16])(*pauVar29 + lVar46 * 4) = auVar85._0_16_;
                *(undefined1 (*) [16])(*pauVar29 + lVar59 * 4) = auVar81._0_16_;
                *(undefined1 (*) [16])(*pauVar29 + lVar62 * 4) = auVar86._0_16_;
                auVar65 = vextracti32x4_avx512f(auVar82,1);
                *(undefined1 (*) [16])(*pauVar29 + lVar57 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar85,1);
                *(undefined1 (*) [16])(*pauVar29 + lVar54 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar81,1);
                *(undefined1 (*) [16])(*pauVar29 + lVar55 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar86,1);
                *(undefined1 (*) [16])(*pauVar29 + lVar63 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar82,2);
                *(undefined1 (*) [16])(*pauVar29 + lVar41 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar85,2);
                *(undefined1 (*) [16])(*pauVar29 + lVar49 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar81,2);
                *(undefined1 (*) [16])(*pauVar29 + lVar20 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar86,2);
                *(undefined1 (*) [16])(*pauVar29 + lVar32 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar82,3);
                *(undefined1 (*) [16])(*pauVar29 + lVar34 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar85,3);
                *(undefined1 (*) [16])(*pauVar29 + lVar53 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar81,3);
                *(undefined1 (*) [16])(*pauVar29 + lVar26 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar86,3);
                *(undefined1 (*) [16])(*pauVar29 + lVar39 * 4) = auVar65;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
              }
              else {
                auVar82 = vshufi64x2_avx512f(auVar83,auVar84,0xee);
                auVar85 = vshufi64x2_avx512f(auVar86,auVar81,0xee);
                if (iVar15 == 4) {
                  auVar83 = vinserti64x4_avx512f(auVar83,auVar84._0_32_,1);
                  auVar81 = vinserti64x4_avx512f(auVar86,auVar81._0_32_,1);
                  auVar84 = vshufi64x2_avx512f(auVar83,auVar81,0x88);
                  auVar83 = vshufi64x2_avx512f(auVar83,auVar81,0xdd);
                  auVar86 = vshufi64x2_avx512f(auVar82,auVar85,0x88);
                  auVar82 = vshufi64x2_avx512f(auVar82,auVar85,0xdd);
                  auVar81 = vmovdqu64_avx512f(auVar84);
                  *pauVar29 = auVar81;
                  auVar81 = vmovdqu64_avx512f(auVar83);
                  *(undefined1 (*) [64])(*pauVar29 + lVar57 * 4) = auVar81;
                  auVar81 = vmovdqu64_avx512f(auVar86);
                  *(undefined1 (*) [64])(*pauVar29 + lVar41 * 4) = auVar81;
                  auVar81 = vmovdqu64_avx512f(auVar82);
                  *(undefined1 (*) [64])(*pauVar29 + lVar34 * 4) = auVar81;
                  pauVar29 = pauVar29 + 1;
                }
                else if (iVar15 == 8) {
                  auVar83 = vinserti64x4_avx512f(auVar83,auVar84._0_32_,1);
                  auVar84 = vinserti64x4_avx512f(auVar86,auVar81._0_32_,1);
                  auVar81 = vmovdqu64_avx512f(auVar83);
                  *pauVar29 = auVar81;
                  auVar81 = vmovdqu64_avx512f(auVar84);
                  pauVar29[1] = auVar81;
                  auVar81 = vmovdqu64_avx512f(auVar82);
                  *(undefined1 (*) [64])(*pauVar29 + lVar41 * 4) = auVar81;
                  auVar81 = vmovdqu64_avx512f(auVar85);
                  *(undefined1 (*) [64])(pauVar29[1] + lVar41 * 4) = auVar81;
                  pauVar29 = pauVar29 + 2;
                }
                else if (iVar15 == 0x10) {
                  auVar82 = vmovdqa64_avx512f(auVar83);
                  *pauVar29 = auVar82;
                  auVar82 = vmovdqa64_avx512f(auVar84);
                  pauVar29[1] = auVar82;
                  auVar82 = vmovdqa64_avx512f(auVar86);
                  pauVar29[2] = auVar82;
                  auVar81 = vmovdqa64_avx512f(auVar81);
                  pauVar29[3] = auVar81;
                  pauVar29 = pauVar29 + 4;
                }
              }
              pauVar36 = pauVar36 + 4;
            }
            for (; iVar56 + 1 < iVar43; iVar56 = iVar56 + 2) {
              auVar81 = vpshufd_avx512f(*pauVar36,0xd8);
              auVar82 = vpshufd_avx512f(pauVar36[1],0x2d);
              auVar83 = vpunpckldq_avx512f(auVar81,auVar82);
              auVar81 = vpermt2d_avx512f(auVar82,auVar77,auVar81);
              if (iVar15 == 1) {
                vpscatterdd_avx512f(ZEXT864(pauVar29) + auVar80 * (undefined1  [64])0x4,0xffff,
                                    auVar83);
                vpscatterdd_avx512f(ZEXT864(pauVar29) + ZEXT864(4) + auVar80 * (undefined1  [64])0x4
                                    ,0xffff,auVar81);
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 8);
              }
              else if (iVar15 == 4) {
                *(undefined1 (*) [16])(*pauVar29 + 0x10) = auVar81._0_16_;
                *(undefined1 (*) [16])*pauVar29 = auVar83._0_16_;
                auVar65 = vextracti32x4_avx512f(auVar81,1);
                *(undefined1 (*) [16])(*pauVar29 + lVar57 * 4 + 8) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar83,1);
                *(undefined1 (*) [16])(*pauVar29 + lVar57 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar81,2);
                *(undefined1 (*) [16])(*pauVar29 + lVar41 * 4 + 8) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar83,2);
                *(undefined1 (*) [16])(*pauVar29 + lVar41 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar81,3);
                *(undefined1 (*) [16])(*pauVar29 + lVar34 * 4 + 8) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar83,3);
                *(undefined1 (*) [16])(*pauVar29 + lVar34 * 4) = auVar65;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
              }
              else if (iVar15 == 8) {
                auVar82 = vinserti64x4_avx512f(auVar83,auVar81._0_32_,1);
                auVar83 = vshufi64x2_avx512f(auVar83,auVar81,0xee);
                auVar81 = vmovdqu64_avx512f(auVar82);
                *pauVar29 = auVar81;
                auVar81 = vmovdqu64_avx512f(auVar83);
                *(undefined1 (*) [64])(*pauVar29 + lVar41 * 4) = auVar81;
                pauVar29 = pauVar29 + 1;
              }
              else if (iVar15 == 0x10) {
                auVar82 = vmovdqa64_avx512f(auVar83);
                *pauVar29 = auVar82;
                auVar81 = vmovdqa64_avx512f(auVar81);
                pauVar29[1] = auVar81;
                pauVar29 = pauVar29 + 2;
              }
              pauVar36 = pauVar36 + 2;
            }
            for (; iVar56 < iVar43; iVar56 = iVar56 + 1) {
              auVar81 = vmovdqa64_avx512f(*pauVar36);
              if (iVar15 == 1) {
                vpscatterdd_avx512f(ZEXT864(pauVar29) + auVar80 * (undefined1  [64])0x4,0xffff,
                                    auVar81);
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 4);
              }
              else if (iVar15 == 4) {
                *(undefined1 (*) [16])*pauVar29 = auVar81._0_16_;
                auVar65 = vextracti32x4_avx512f(auVar81,1);
                *(undefined1 (*) [16])(*pauVar29 + lVar57 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar81,2);
                *(undefined1 (*) [16])(*pauVar29 + lVar41 * 4) = auVar65;
                auVar65 = vextracti32x4_avx512f(auVar81,3);
                *(undefined1 (*) [16])(*pauVar29 + lVar34 * 4) = auVar65;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
              }
              else if (iVar15 == 8) {
                *(undefined1 (*) [32])*pauVar29 = auVar81._0_32_;
                auVar73 = vextracti64x4_avx512f(auVar81,1);
                *(undefined1 (*) [32])(*pauVar29 + lVar41 * 4) = auVar73;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
              }
              else if (iVar15 == 0x10) {
                auVar81 = vmovdqa64_avx512f(auVar81);
                *pauVar29 = auVar81;
                pauVar29 = pauVar29 + 1;
              }
              pauVar36 = pauVar36 + 1;
            }
            local_78._0_8_ = local_78._0_8_ + local_250;
            local_278 = local_278 + local_250;
            local_260 = local_260 + local_250;
            local_298 = local_298 + local_250;
          }
          auVar73 = vpbroadcastd_avx512vl();
          auVar73 = vpmulld_avx2(auVar73,_DAT_0053a5c0);
          lVar20 = lVar46 * 0x20;
          lVar49 = local_78._0_8_;
          for (; (long)(uVar40 | 7) < lVar19; uVar40 = uVar40 + 8) {
            pauVar29 = (undefined1 (*) [64])
                       ((long)local_228->data + lVar28 * 4 + (lVar18 + uVar40) * lVar46 * 4);
            for (iVar56 = 0; iVar56 + 0xf < iVar43; iVar56 = iVar56 + 0x10) {
              auVar80 = vmovdqa64_avx512f(*pauVar36);
              auVar81 = vmovdqa64_avx512f(pauVar36[2]);
              auVar82 = vmovdqa64_avx512f(pauVar36[4]);
              auVar83 = vpshufd_avx512f(pauVar36[1],0x93);
              auVar84 = vpshufd_avx512f(pauVar36[3],0x93);
              auVar85 = vpshufd_avx512f(pauVar36[5],0x93);
              auVar86 = vmovdqa64_avx512f(pauVar36[6]);
              auVar87 = vpshufd_avx512f(pauVar36[7],0x93);
              auVar88 = vpunpckldq_avx512f(auVar80,auVar84);
              auVar80 = vpunpckhdq_avx512f(auVar80,auVar84);
              auVar84 = vpunpckldq_avx512f(auVar81,auVar83);
              auVar81 = vpunpckhdq_avx512f(auVar81,auVar83);
              auVar83 = vpunpckldq_avx512f(auVar82,auVar87);
              auVar82 = vpunpckhdq_avx512f(auVar82,auVar87);
              auVar87 = vpunpckldq_avx512f(auVar86,auVar85);
              auVar85 = vpunpckhdq_avx512f(auVar86,auVar85);
              auVar86 = vpunpcklqdq_avx512f(auVar88,auVar84);
              auVar89 = vpunpcklqdq_avx512f(auVar81,auVar80);
              auVar90 = vpunpcklqdq_avx512f(auVar83,auVar87);
              auVar91 = vpunpcklqdq_avx512f(auVar85,auVar82);
              auVar84 = vpermt2d_avx512f(auVar84,auVar76,auVar88);
              auVar80 = vpermt2d_avx512f(auVar80,auVar76,auVar81);
              auVar81 = vpermt2d_avx512f(auVar87,auVar76,auVar83);
              auVar82 = vpermt2d_avx512f(auVar82,auVar76,auVar85);
              auVar83 = vshufi64x2_avx512f(auVar86,auVar90,0x14);
              auVar85 = vshufi64x2_avx512f(auVar86,auVar90,0xbe);
              auVar86 = vshufi64x2_avx512f(auVar84,auVar81,0x14);
              auVar81 = vshufi64x2_avx512f(auVar84,auVar81,0xbe);
              auVar84 = vshufi64x2_avx512f(auVar89,auVar91,0x14);
              auVar87 = vshufi64x2_avx512f(auVar89,auVar91,0xbe);
              auVar88 = vshufi64x2_avx512f(auVar80,auVar82,0x14);
              auVar80 = vshufi64x2_avx512f(auVar80,auVar82,0xbe);
              auVar82 = vshufi64x2_avx512f(auVar83,auVar85,0x88);
              auVar89 = vshufi64x2_avx512f(auVar86,auVar81,0x88);
              auVar90 = vshufi64x2_avx512f(auVar84,auVar87,0x88);
              auVar91 = vshufi64x2_avx512f(auVar88,auVar80,0x88);
              auVar83 = vshufi64x2_avx512f(auVar83,auVar85,0x77);
              auVar81 = vshufi64x2_avx512f(auVar86,auVar81,0x77);
              auVar84 = vshufi64x2_avx512f(auVar84,auVar87,0x77);
              auVar80 = vshufi64x2_avx512f(auVar88,auVar80,0x77);
              if (iVar15 == 1) {
                auVar85 = vpunpckldq_avx512f(auVar82,auVar89);
                auVar86 = vpunpckldq_avx512f(auVar90,auVar91);
                auVar87 = vpunpckldq_avx512f(auVar83,auVar81);
                auVar88 = vpunpckldq_avx512f(auVar84,auVar80);
                auVar82 = vpunpckhdq_avx512f(auVar82,auVar89);
                auVar89 = vpunpckhdq_avx512f(auVar90,auVar91);
                auVar81 = vpunpckhdq_avx512f(auVar83,auVar81);
                auVar80 = vpunpckhdq_avx512f(auVar84,auVar80);
                auVar83 = vpunpcklqdq_avx512f(auVar85,auVar86);
                auVar84 = vpunpcklqdq_avx512f(auVar87,auVar88);
                auVar85 = vpunpckhqdq_avx512f(auVar85,auVar86);
                auVar86 = vpunpckhqdq_avx512f(auVar87,auVar88);
                auVar87 = vpunpcklqdq_avx512f(auVar82,auVar89);
                auVar88 = vpunpcklqdq_avx512f(auVar81,auVar80);
                auVar82 = vpunpckhqdq_avx512f(auVar82,auVar89);
                auVar80 = vpunpckhqdq_avx512f(auVar81,auVar80);
                auVar81 = vmovdqa64_avx512f(auVar83);
                auVar81 = vpermt2q_avx512f(auVar81,auVar78,auVar84);
                auVar89 = vmovdqa64_avx512f(auVar85);
                auVar89 = vpermt2q_avx512f(auVar89,auVar78,auVar86);
                auVar90 = vmovdqa64_avx512f(auVar87);
                auVar90 = vpermt2q_avx512f(auVar90,auVar78,auVar88);
                auVar91 = vmovdqa64_avx512f(auVar82);
                auVar91 = vpermt2q_avx512f(auVar91,auVar78,auVar80);
                auVar83 = vpermt2q_avx512f(auVar83,auVar79,auVar84);
                auVar84 = vpermt2q_avx512f(auVar85,auVar79,auVar86);
                auVar85 = vpermt2q_avx512f(auVar87,auVar79,auVar88);
                auVar82 = vpermt2q_avx512f(auVar82,auVar79,auVar80);
                auVar80 = vmovdqu64_avx512f(auVar81);
                *pauVar29 = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar89);
                *(undefined1 (*) [64])(*pauVar29 + lVar46 * 4) = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar90);
                *(undefined1 (*) [64])(*pauVar29 + lVar59 * 4) = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar91);
                *(undefined1 (*) [64])(*pauVar29 + lVar62 * 4) = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar83);
                *(undefined1 (*) [64])(*pauVar29 + lVar57 * 4) = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar84);
                *(undefined1 (*) [64])(*pauVar29 + lVar54 * 4) = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar85);
                *(undefined1 (*) [64])(*pauVar29 + lVar55 * 4) = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar82);
                *(undefined1 (*) [64])(*pauVar29 + lVar63 * 4) = auVar80;
                pauVar29 = pauVar29 + 1;
              }
              else if (iVar15 == 4) {
                auVar85 = vshufi64x2_avx512f(auVar82,auVar89,0x88);
                auVar86 = vshufi64x2_avx512f(auVar90,auVar91,0x88);
                auVar87 = vshufi64x2_avx512f(auVar83,auVar81,0x88);
                auVar88 = vshufi64x2_avx512f(auVar84,auVar80,0x88);
                auVar82 = vshufi64x2_avx512f(auVar82,auVar89,0xdd);
                auVar89 = vshufi64x2_avx512f(auVar90,auVar91,0xdd);
                auVar81 = vshufi64x2_avx512f(auVar83,auVar81,0xdd);
                auVar80 = vshufi64x2_avx512f(auVar84,auVar80,0xdd);
                auVar83 = vshufi64x2_avx512f(auVar85,auVar86,0x88);
                auVar84 = vshufi64x2_avx512f(auVar87,auVar88,0x88);
                auVar85 = vshufi64x2_avx512f(auVar85,auVar86,0xdd);
                auVar86 = vshufi64x2_avx512f(auVar87,auVar88,0xdd);
                auVar87 = vshufi64x2_avx512f(auVar82,auVar89,0x88);
                auVar88 = vshufi64x2_avx512f(auVar81,auVar80,0x88);
                auVar82 = vshufi64x2_avx512f(auVar82,auVar89,0xdd);
                auVar81 = vshufi64x2_avx512f(auVar81,auVar80,0xdd);
                auVar80 = vmovdqu64_avx512f(auVar83);
                *pauVar29 = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar84);
                pauVar29[1] = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar85);
                pauVar29[2] = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar86);
                pauVar29[3] = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar87);
                *(undefined1 (*) [64])(*pauVar29 + lVar57 * 4) = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar88);
                *(undefined1 (*) [64])(pauVar29[1] + lVar57 * 4) = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar82);
                *(undefined1 (*) [64])(pauVar29[2] + lVar57 * 4) = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar81);
                *(undefined1 (*) [64])(pauVar29[3] + lVar57 * 4) = auVar80;
                pauVar29 = pauVar29 + 4;
              }
              else if (iVar15 == 8) {
                auVar85 = vinserti64x4_avx512f(auVar82,auVar89._0_32_,1);
                auVar86 = vinserti64x4_avx512f(auVar90,auVar91._0_32_,1);
                auVar87 = vinserti64x4_avx512f(auVar83,auVar81._0_32_,1);
                auVar88 = vinserti64x4_avx512f(auVar84,auVar80._0_32_,1);
                auVar82 = vshufi64x2_avx512f(auVar82,auVar89,0xee);
                auVar89 = vshufi64x2_avx512f(auVar90,auVar91,0xee);
                auVar81 = vshufi64x2_avx512f(auVar83,auVar81,0xee);
                auVar83 = vshufi64x2_avx512f(auVar84,auVar80,0xee);
                auVar80 = vmovdqu64_avx512f(auVar85);
                *pauVar29 = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar86);
                pauVar29[1] = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar87);
                pauVar29[2] = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar88);
                pauVar29[3] = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar82);
                pauVar29[4] = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar89);
                pauVar29[5] = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar81);
                pauVar29[6] = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar83);
                pauVar29[7] = auVar80;
                pauVar29 = pauVar29 + 8;
              }
              pauVar36 = pauVar36 + 8;
            }
            for (; iVar56 + 7 < iVar43; iVar56 = iVar56 + 8) {
              auVar68 = *(undefined1 (*) [32])*pauVar36;
              auVar69 = *(undefined1 (*) [32])(*pauVar36 + 0x20);
              auVar70 = *(undefined1 (*) [32])pauVar36[1];
              auVar115 = *(undefined1 (*) [32])(pauVar36[1] + 0x20);
              auVar114 = *(undefined1 (*) [32])pauVar36[2];
              auVar71 = *(undefined1 (*) [32])(pauVar36[2] + 0x20);
              auVar72 = *(undefined1 (*) [32])pauVar36[3];
              auVar111 = *(undefined1 (*) [32])(pauVar36[3] + 0x20);
              auVar10 = vpshufd_avx2(auVar69,0x93);
              auVar116 = vpshufd_avx2(auVar115,0x93);
              auVar117 = vpshufd_avx2(auVar71,0x93);
              auVar119 = vpshufd_avx2(auVar111,0x93);
              auVar120 = vpunpckldq_avx2(auVar68,auVar116);
              auVar116 = vpunpckhdq_avx2(auVar68,auVar116);
              auVar75 = vpunpckldq_avx2(auVar70,auVar10);
              auVar10 = vpunpckhdq_avx2(auVar70,auVar10);
              auVar118 = vpunpckldq_avx2(auVar114,auVar119);
              auVar119 = vpunpckhdq_avx2(auVar114,auVar119);
              auVar74 = vpunpckldq_avx512vl(auVar72,auVar117);
              auVar117 = vpunpckhdq_avx2(auVar72,auVar117);
              auVar120 = vpunpcklqdq_avx2(auVar120,auVar75);
              auVar10 = vpunpcklqdq_avx2(auVar10,auVar116);
              auVar75 = vpunpcklqdq_avx512vl(auVar118,auVar74);
              auVar116 = vpunpcklqdq_avx2(auVar117,auVar119);
              auVar117 = vpunpcklqdq_avx2(auVar68,auVar115);
              auVar119 = vpunpcklqdq_avx2(auVar69,auVar70);
              auVar117 = vpblendd_avx2(auVar119,auVar117,0x66);
              auVar69 = vpunpckhqdq_avx2(auVar70,auVar69);
              auVar68 = vpunpckhqdq_avx2(auVar115,auVar68);
              auVar70 = vpblendd_avx2(auVar68,auVar69,0x66);
              auVar68 = vpunpcklqdq_avx2(auVar114,auVar111);
              auVar69 = vpunpcklqdq_avx2(auVar71,auVar72);
              auVar115 = vpblendd_avx2(auVar69,auVar68,0x66);
              auVar68 = vpunpckhqdq_avx2(auVar72,auVar71);
              auVar69 = vpunpckhqdq_avx2(auVar111,auVar114);
              auVar68 = vpblendd_avx2(auVar69,auVar68,0x66);
              auVar69 = vpblendd_avx2(auVar120,auVar75,0xf0);
              auVar114 = vpblendd_avx2(auVar117,auVar115,0xf0);
              auVar71 = vpblendd_avx2(auVar10,auVar116,0xf0);
              auVar72 = vpblendd_avx2(auVar70,auVar68,0xf0);
              auVar111 = vpblendd_avx2(auVar75,auVar120,0xf0);
              auVar115 = vpblendd_avx2(auVar115,auVar117,0xf0);
              auVar10 = vpblendd_avx2(auVar116,auVar10,0xf0);
              auVar68 = vpblendd_avx2(auVar68,auVar70,0xf0);
              if (iVar15 == 1) {
                auVar116 = vpunpckldq_avx2(auVar69,auVar114);
                auVar69 = vpunpckhdq_avx2(auVar69,auVar114);
                auVar114 = vpunpckldq_avx2(auVar71,auVar72);
                auVar70 = vpunpckhdq_avx2(auVar71,auVar72);
                auVar72 = vpunpckldq_avx2(auVar111,auVar115);
                auVar115 = vpunpckhdq_avx2(auVar111,auVar115);
                auVar111 = vpunpckldq_avx2(auVar10,auVar68);
                auVar68 = vpunpckhdq_avx2(auVar10,auVar68);
                auVar10 = vpunpcklqdq_avx2(auVar116,auVar114);
                auVar114 = vpunpckhqdq_avx2(auVar116,auVar114);
                auVar116 = vpunpcklqdq_avx2(auVar69,auVar70);
                auVar71 = vpunpckhqdq_avx2(auVar69,auVar70);
                auVar70 = vpunpcklqdq_avx2(auVar72,auVar111);
                auVar69 = vpunpckhqdq_avx2(auVar72,auVar111);
                auVar72 = vpunpcklqdq_avx2(auVar115,auVar68);
                auVar115 = vpunpckhqdq_avx2(auVar115,auVar68);
                auVar111._0_16_ = ZEXT116(0) * auVar70._0_16_ + ZEXT116(1) * auVar10._0_16_;
                auVar111._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar70._0_16_;
                auVar117._0_16_ = ZEXT116(0) * auVar69._0_16_ + ZEXT116(1) * auVar114._0_16_;
                auVar117._16_16_ = ZEXT116(0) * auVar114._16_16_ + ZEXT116(1) * auVar69._0_16_;
                auVar119._0_16_ = ZEXT116(0) * auVar72._0_16_ + ZEXT116(1) * auVar116._0_16_;
                auVar119._16_16_ = ZEXT116(0) * auVar116._16_16_ + ZEXT116(1) * auVar72._0_16_;
                auVar120._0_16_ = ZEXT116(0) * auVar115._0_16_ + ZEXT116(1) * auVar71._0_16_;
                auVar120._16_16_ = ZEXT116(0) * auVar71._16_16_ + ZEXT116(1) * auVar115._0_16_;
                auVar68 = vperm2f128_avx(auVar10,auVar70,0x31);
                auVar69 = vperm2f128_avx(auVar114,auVar69,0x31);
                auVar70 = vperm2f128_avx(auVar116,auVar72,0x31);
                auVar115 = vperm2f128_avx(auVar71,auVar115,0x31);
                *(undefined1 (*) [32])*pauVar29 = auVar111;
                *(undefined1 (*) [32])(*pauVar29 + lVar46 * 4) = auVar117;
                *(undefined1 (*) [32])(*pauVar29 + lVar59 * 4) = auVar119;
                *(undefined1 (*) [32])(*pauVar29 + lVar62 * 4) = auVar120;
                *(undefined1 (*) [32])(*pauVar29 + lVar57 * 4) = auVar68;
                *(undefined1 (*) [32])(*pauVar29 + lVar54 * 4) = auVar69;
                *(undefined1 (*) [32])(*pauVar29 + lVar55 * 4) = auVar70;
                *(undefined1 (*) [32])(*pauVar29 + lVar63 * 4) = auVar115;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
              }
              else if (iVar15 == 4) {
                auVar116._0_16_ = ZEXT116(0) * auVar114._0_16_ + ZEXT116(1) * auVar69._0_16_;
                auVar116._16_16_ = ZEXT116(0) * auVar69._16_16_ + ZEXT116(1) * auVar114._0_16_;
                auVar75._0_16_ = ZEXT116(0) * auVar72._0_16_ + ZEXT116(1) * auVar71._0_16_;
                auVar75._16_16_ = ZEXT116(0) * auVar71._16_16_ + ZEXT116(1) * auVar72._0_16_;
                auVar118._0_16_ = ZEXT116(0) * auVar115._0_16_ + ZEXT116(1) * auVar111._0_16_;
                auVar118._16_16_ = ZEXT116(0) * auVar111._16_16_ + ZEXT116(1) * auVar115._0_16_;
                auVar74._0_16_ = ZEXT116(0) * auVar68._0_16_ + ZEXT116(1) * auVar10._0_16_;
                auVar74._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar68._0_16_;
                auVar69 = vperm2i128_avx2(auVar69,auVar114,0x31);
                auVar70 = vperm2i128_avx2(auVar71,auVar72,0x31);
                auVar115 = vperm2i128_avx2(auVar111,auVar115,0x31);
                auVar68 = vperm2i128_avx2(auVar10,auVar68,0x31);
                *(undefined1 (*) [32])*pauVar29 = auVar116;
                *(undefined1 (*) [32])(*pauVar29 + 0x20) = auVar75;
                *(undefined1 (*) [32])pauVar29[1] = auVar118;
                *(undefined1 (*) [32])(pauVar29[1] + 0x20) = auVar74;
                *(undefined1 (*) [32])(*pauVar29 + lVar57 * 4) = auVar69;
                *(undefined1 (*) [32])(*pauVar29 + lVar57 * 4 + 0x20) = auVar70;
                *(undefined1 (*) [32])(pauVar29[1] + lVar57 * 4) = auVar115;
                *(undefined1 (*) [32])(pauVar29[1] + lVar57 * 4 + 0x20) = auVar68;
                pauVar29 = pauVar29 + 2;
              }
              else if (iVar15 == 8) {
                *(undefined1 (*) [32])*pauVar29 = auVar69;
                *(undefined1 (*) [32])(*pauVar29 + 0x20) = auVar114;
                *(undefined1 (*) [32])pauVar29[1] = auVar71;
                *(undefined1 (*) [32])(pauVar29[1] + 0x20) = auVar72;
                *(undefined1 (*) [32])pauVar29[2] = auVar111;
                *(undefined1 (*) [32])(pauVar29[2] + 0x20) = auVar115;
                *(undefined1 (*) [32])pauVar29[3] = auVar10;
                *(undefined1 (*) [32])(pauVar29[3] + 0x20) = auVar68;
                pauVar29 = pauVar29 + 4;
              }
              pauVar36 = pauVar36 + 4;
            }
            for (; iVar56 + 3 < iVar43; iVar56 = iVar56 + 4) {
              auVar68 = vpshufd_avx2(*(undefined1 (*) [32])(*pauVar36 + 0x20),0x93);
              auVar69 = vpshufd_avx2(*(undefined1 (*) [32])(pauVar36[1] + 0x20),0x93);
              auVar115 = vpunpckldq_avx2(*(undefined1 (*) [32])*pauVar36,auVar69);
              auVar69 = vpunpckhdq_avx2(*(undefined1 (*) [32])*pauVar36,auVar69);
              auVar114 = vpunpckldq_avx2(*(undefined1 (*) [32])pauVar36[1],auVar68);
              auVar70 = vpunpckhdq_avx2(*(undefined1 (*) [32])pauVar36[1],auVar68);
              auVar71 = vpunpcklqdq_avx2(auVar115,auVar114);
              auVar72 = vpunpcklqdq_avx2(auVar70,auVar69);
              auVar68 = vpmovsxbd_avx2(ZEXT816(0x60f0e07020b0a03));
              auVar115 = vpermt2d_avx512vl(auVar114,auVar68,auVar115);
              auVar68 = vpermt2d_avx512vl(auVar69,auVar68,auVar70);
              if (iVar15 == 1) {
                auVar70 = vpunpckldq_avx2(auVar71,auVar115);
                auVar69 = vpunpckhdq_avx2(auVar71,auVar115);
                auVar115 = vpunpckldq_avx2(auVar72,auVar68);
                auVar68 = vpunpckhdq_avx2(auVar72,auVar68);
                auVar114 = vpunpcklqdq_avx2(auVar70,auVar115);
                auVar70 = vpunpckhqdq_avx2(auVar70,auVar115);
                auVar115 = vpunpcklqdq_avx2(auVar69,auVar68);
                auVar68 = vpunpckhqdq_avx2(auVar69,auVar68);
                *(undefined1 (*) [16])*pauVar29 = auVar114._0_16_;
                *(undefined1 (*) [16])(*pauVar29 + lVar46 * 4) = auVar70._0_16_;
                *(undefined1 (*) [16])(*pauVar29 + lVar59 * 4) = auVar115._0_16_;
                *(undefined1 (*) [16])(*pauVar29 + lVar62 * 4) = auVar68._0_16_;
                *(undefined1 (*) [16])(*pauVar29 + lVar57 * 4) = auVar114._16_16_;
                *(undefined1 (*) [16])(*pauVar29 + lVar54 * 4) = auVar70._16_16_;
                *(undefined1 (*) [16])(*pauVar29 + lVar55 * 4) = auVar115._16_16_;
                *(undefined1 (*) [16])(*pauVar29 + lVar63 * 4) = auVar68._16_16_;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
              }
              else if (iVar15 == 4) {
                auVar70._0_16_ = ZEXT116(0) * auVar115._0_16_ + ZEXT116(1) * auVar71._0_16_;
                auVar70._16_16_ = ZEXT116(0) * auVar71._16_16_ + ZEXT116(1) * auVar115._0_16_;
                auVar114._0_16_ = ZEXT116(0) * auVar68._0_16_ + ZEXT116(1) * auVar72._0_16_;
                auVar114._16_16_ = ZEXT116(0) * auVar72._16_16_ + ZEXT116(1) * auVar68._0_16_;
                auVar69 = vperm2i128_avx2(auVar71,auVar115,0x31);
                auVar68 = vperm2i128_avx2(auVar72,auVar68,0x31);
                *(undefined1 (*) [32])*pauVar29 = auVar70;
                *(undefined1 (*) [32])(*pauVar29 + 0x20) = auVar114;
                *(undefined1 (*) [32])(*pauVar29 + lVar57 * 4) = auVar69;
                *(undefined1 (*) [32])(*pauVar29 + lVar57 * 4 + 0x20) = auVar68;
                pauVar29 = pauVar29 + 1;
              }
              else if (iVar15 == 8) {
                *(undefined1 (*) [32])*pauVar29 = auVar71;
                *(undefined1 (*) [32])(*pauVar29 + 0x20) = auVar115;
                *(undefined1 (*) [32])pauVar29[1] = auVar72;
                *(undefined1 (*) [32])(pauVar29[1] + 0x20) = auVar68;
                pauVar29 = pauVar29 + 2;
              }
              pauVar36 = pauVar36 + 2;
            }
            for (; iVar56 + 1 < iVar43; iVar56 = iVar56 + 2) {
              auVar68 = vpblendd_avx2(*(undefined1 (*) [32])*pauVar36,
                                      *(undefined1 (*) [32])(*pauVar36 + 0x20),0xaa);
              auVar69 = vpblendd_avx2(*(undefined1 (*) [32])(*pauVar36 + 0x20),
                                      *(undefined1 (*) [32])*pauVar36,0xaa);
              if (iVar15 == 1) {
                vpscatterdd_avx512vl
                          (ZEXT832(pauVar29) + auVar73 * (undefined1  [32])0x4,0xffff,auVar68);
                vpscatterdd_avx512vl
                          (ZEXT832(pauVar29) + ZEXT832(4) + auVar73 * (undefined1  [32])0x4,0xffff,
                           auVar69);
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 8);
              }
              else if (iVar15 == 4) {
                auVar115._0_16_ = ZEXT116(0) * auVar69._0_16_ + ZEXT116(1) * auVar68._0_16_;
                auVar115._16_16_ = ZEXT116(0) * auVar68._16_16_ + ZEXT116(1) * auVar69._0_16_;
                auVar68 = vperm2i128_avx2(auVar68,auVar69,0x31);
                *(undefined1 (*) [32])*pauVar29 = auVar115;
                *(undefined1 (*) [32])(*pauVar29 + lVar57 * 4) = auVar68;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
              }
              else if (iVar15 == 8) {
                *(undefined1 (*) [32])*pauVar29 = auVar68;
                *(undefined1 (*) [32])(*pauVar29 + 0x20) = auVar69;
                pauVar29 = pauVar29 + 1;
              }
              pauVar36 = pauVar36 + 1;
            }
            for (; iVar56 < iVar43; iVar56 = iVar56 + 1) {
              auVar68 = *(undefined1 (*) [32])*pauVar36;
              if (iVar15 == 1) {
                vpscatterdd_avx512vl
                          (ZEXT832(pauVar29) + auVar73 * (undefined1  [32])0x4,0xffff,auVar68);
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 4);
              }
              else if (iVar15 == 4) {
                *(undefined1 (*) [16])*pauVar29 = auVar68._0_16_;
                *(undefined1 (*) [16])(*pauVar29 + lVar57 * 4) = auVar68._16_16_;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
              }
              else if (iVar15 == 8) {
                *(undefined1 (*) [32])*pauVar29 = auVar68;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
              }
              pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x20);
            }
            lVar49 = lVar49 + lVar20;
            local_278 = local_278 + lVar20;
            local_260 = local_260 + lVar20;
            local_298 = local_298 + lVar20;
          }
          auVar65 = vpbroadcastd_avx512vl();
          auVar65 = vpmulld_avx(auVar65,_DAT_00539290);
          lVar57 = lVar46 * 0x10;
          for (; (long)(uVar40 | 3) < lVar19; uVar40 = uVar40 + 4) {
            pauVar29 = (undefined1 (*) [64])
                       ((long)local_228->data + lVar28 * 4 + (lVar18 + uVar40) * lVar46 * 4);
            for (iVar56 = 0; iVar56 + 0xf < iVar43; iVar56 = iVar56 + 0x10) {
              auVar80 = vmovdqu64_avx512f(*pauVar36);
              auVar81 = vpshufd_avx512f(pauVar36[1],0x93);
              auVar82 = vmovdqu64_avx512f(pauVar36[2]);
              auVar83 = vpshufd_avx512f(pauVar36[3],0x93);
              auVar84 = vpunpckldq_avx512f(auVar80,auVar83);
              auVar85 = vpunpckldq_avx512f(auVar82,auVar81);
              auVar80 = vpunpckhdq_avx512f(auVar80,auVar83);
              auVar81 = vpunpckhdq_avx512f(auVar82,auVar81);
              auVar82 = vpunpcklqdq_avx512f(auVar84,auVar85);
              auVar83 = vpunpcklqdq_avx512f(auVar81,auVar80);
              auVar84 = vpermt2d_avx512f(auVar85,auVar76,auVar84);
              auVar80 = vpermt2d_avx512f(auVar80,auVar76,auVar81);
              if (iVar15 == 1) {
                auVar81 = vpunpckldq_avx512f(auVar82,auVar84);
                auVar85 = vpunpckldq_avx512f(auVar83,auVar80);
                auVar82 = vpunpckhdq_avx512f(auVar82,auVar84);
                auVar80 = vpunpckhdq_avx512f(auVar83,auVar80);
                auVar83 = vpunpcklqdq_avx512f(auVar81,auVar85);
                auVar81 = vpunpckhqdq_avx512f(auVar81,auVar85);
                auVar84 = vpunpcklqdq_avx512f(auVar82,auVar80);
                auVar82 = vpunpckhqdq_avx512f(auVar82,auVar80);
                auVar80 = vmovdqu64_avx512f(auVar83);
                *pauVar29 = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar81);
                *(undefined1 (*) [64])(*pauVar29 + lVar46 * 4) = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar84);
                *(undefined1 (*) [64])(*pauVar29 + lVar59 * 4) = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar82);
                *(undefined1 (*) [64])(*pauVar29 + lVar62 * 4) = auVar80;
                pauVar29 = pauVar29 + 1;
              }
              else if (iVar15 == 4) {
                auVar81 = vinserti64x4_avx512f(auVar82,auVar84._0_32_,1);
                auVar85 = vinserti64x4_avx512f(auVar83,auVar80._0_32_,1);
                auVar82 = vshufi64x2_avx512f(auVar82,auVar84,0xee);
                auVar80 = vshufi64x2_avx512f(auVar83,auVar80,0xee);
                auVar83 = vshufi64x2_avx512f(auVar81,auVar85,0x88);
                auVar81 = vshufi64x2_avx512f(auVar81,auVar85,0xdd);
                auVar84 = vshufi64x2_avx512f(auVar82,auVar80,0x88);
                auVar82 = vshufi64x2_avx512f(auVar82,auVar80,0xdd);
                auVar80 = vmovdqu64_avx512f(auVar83);
                *pauVar29 = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar81);
                pauVar29[1] = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar84);
                pauVar29[2] = auVar80;
                auVar80 = vmovdqu64_avx512f(auVar82);
                pauVar29[3] = auVar80;
                pauVar29 = pauVar29 + 4;
              }
              pauVar36 = pauVar36 + 4;
            }
            for (; iVar56 + 7 < iVar43; iVar56 = iVar56 + 8) {
              auVar66 = vpshufd_avx(*(undefined1 (*) [16])pauVar36[1],0x93);
              auVar110 = vpshufd_avx(*(undefined1 (*) [16])(pauVar36[1] + 0x10),0x93);
              auVar67 = vpshufd_avx(*(undefined1 (*) [16])(pauVar36[1] + 0x20),0x93);
              auVar113 = vpshufd_avx(*(undefined1 (*) [16])(pauVar36[1] + 0x30),0x93);
              auVar105 = vpunpckldq_avx(*(undefined1 (*) [16])*pauVar36,auVar67);
              auVar67 = vpunpckhdq_avx(*(undefined1 (*) [16])*pauVar36,auVar67);
              auVar107 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar36 + 0x10),auVar113);
              auVar113 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar36 + 0x10),auVar113);
              auVar106 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar36 + 0x20),auVar66);
              auVar112 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar36 + 0x20),auVar66);
              auVar108 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar36 + 0x30),auVar110);
              auVar109 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar36 + 0x30),auVar110);
              auVar1 = vpunpcklqdq_avx(auVar105,auVar106);
              auVar3 = vpunpcklqdq_avx(auVar112,auVar67);
              auVar2 = vpunpcklqdq_avx(auVar107,auVar108);
              auVar9 = vpunpcklqdq_avx(auVar109,auVar113);
              auVar66 = vpunpckhdq_avx(auVar106,auVar105);
              auVar66 = vpshufd_avx(auVar66,0x36);
              auVar110 = vpunpckhdq_avx(auVar67,auVar112);
              auVar110 = vpshufd_avx(auVar110,0x36);
              auVar67 = vpunpckhdq_avx(auVar108,auVar107);
              auVar67 = vpshufd_avx(auVar67,0x36);
              auVar113 = vpunpckhdq_avx(auVar113,auVar109);
              auVar113 = vpshufd_avx(auVar113,0x36);
              if (iVar15 == 1) {
                auVar112 = vpunpckldq_avx(auVar1,auVar66);
                auVar66 = vpunpckhdq_avx(auVar1,auVar66);
                auVar109 = vpunpckldq_avx(auVar3,auVar110);
                auVar110 = vpunpckhdq_avx(auVar3,auVar110);
                auVar107 = vpunpcklqdq_avx(auVar112,auVar109);
                auVar112 = vpunpckhqdq_avx(auVar112,auVar109);
                auVar106 = vpunpcklqdq_avx(auVar66,auVar110);
                auVar109 = vpunpckhqdq_avx(auVar66,auVar110);
                auVar105 = vpunpckldq_avx(auVar2,auVar67);
                auVar66 = vpunpckhdq_avx(auVar2,auVar67);
                auVar67 = vpunpckldq_avx(auVar9,auVar113);
                auVar110 = vpunpckhdq_avx(auVar9,auVar113);
                auVar113 = vpunpcklqdq_avx(auVar105,auVar67);
                auVar67 = vpunpckhqdq_avx(auVar105,auVar67);
                auVar105 = vpunpcklqdq_avx(auVar66,auVar110);
                auVar66 = vpunpckhqdq_avx(auVar66,auVar110);
                *(undefined1 (*) [16])*pauVar29 = auVar107;
                *(undefined1 (*) [16])(*pauVar29 + 0x10) = auVar113;
                *(undefined1 (*) [16])(*pauVar29 + lVar46 * 4) = auVar112;
                *(undefined1 (*) [16])(*pauVar29 + lVar46 * 4 + 0x10) = auVar67;
                *(undefined1 (*) [16])(*pauVar29 + lVar59 * 4) = auVar106;
                *(undefined1 (*) [16])(*pauVar29 + lVar59 * 4 + 0x10) = auVar105;
                *(undefined1 (*) [16])(*pauVar29 + lVar62 * 4) = auVar109;
                *(undefined1 (*) [16])(*pauVar29 + lVar62 * 4 + 0x10) = auVar66;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
              }
              else if (iVar15 == 4) {
                *(undefined1 (*) [16])*pauVar29 = auVar1;
                *(undefined1 (*) [16])(*pauVar29 + 0x10) = auVar66;
                *(undefined1 (*) [16])(*pauVar29 + 0x20) = auVar3;
                *(undefined1 (*) [16])(*pauVar29 + 0x30) = auVar110;
                *(undefined1 (*) [16])pauVar29[1] = auVar2;
                *(undefined1 (*) [16])(pauVar29[1] + 0x10) = auVar67;
                *(undefined1 (*) [16])(pauVar29[1] + 0x20) = auVar9;
                *(undefined1 (*) [16])(pauVar29[1] + 0x30) = auVar113;
                pauVar29 = pauVar29 + 2;
              }
              pauVar36 = pauVar36 + 2;
            }
            for (; iVar56 + 3 < iVar43; iVar56 = iVar56 + 4) {
              auVar66 = vpshufd_avx(*(undefined1 (*) [16])(*pauVar36 + 0x10),0x93);
              auVar110 = vpshufd_avx(*(undefined1 (*) [16])(*pauVar36 + 0x30),0x93);
              auVar113 = vpunpckldq_avx(*(undefined1 (*) [16])*pauVar36,auVar110);
              auVar110 = vpunpckhdq_avx(*(undefined1 (*) [16])*pauVar36,auVar110);
              auVar112 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar36 + 0x20),auVar66);
              auVar67 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar36 + 0x20),auVar66);
              auVar109 = vpunpcklqdq_avx(auVar113,auVar112);
              auVar105 = vpunpcklqdq_avx(auVar67,auVar110);
              auVar66 = vpunpckhdq_avx(auVar112,auVar113);
              auVar66 = vpshufd_avx(auVar66,0x36);
              auVar110 = vpunpckhdq_avx(auVar110,auVar67);
              auVar110 = vpshufd_avx(auVar110,0x36);
              if (iVar15 == 1) {
                auVar67 = vpunpckldq_avx(auVar109,auVar66);
                auVar66 = vpunpckhdq_avx(auVar109,auVar66);
                auVar113 = vpunpckldq_avx(auVar105,auVar110);
                auVar110 = vpunpckhdq_avx(auVar105,auVar110);
                auVar112 = vpunpcklqdq_avx(auVar67,auVar113);
                auVar67 = vpunpckhqdq_avx(auVar67,auVar113);
                auVar113 = vpunpcklqdq_avx(auVar66,auVar110);
                auVar66 = vpunpckhqdq_avx(auVar66,auVar110);
                *(undefined1 (*) [16])*pauVar29 = auVar112;
                *(undefined1 (*) [16])(*pauVar29 + lVar46 * 4) = auVar67;
                *(undefined1 (*) [16])(*pauVar29 + lVar59 * 4) = auVar113;
                *(undefined1 (*) [16])(*pauVar29 + lVar62 * 4) = auVar66;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
              }
              else if (iVar15 == 4) {
                *(undefined1 (*) [16])*pauVar29 = auVar109;
                *(undefined1 (*) [16])(*pauVar29 + 0x10) = auVar66;
                *(undefined1 (*) [16])(*pauVar29 + 0x20) = auVar105;
                *(undefined1 (*) [16])(*pauVar29 + 0x30) = auVar110;
                pauVar29 = pauVar29 + 1;
              }
              pauVar36 = pauVar36 + 1;
            }
            for (; iVar56 + 1 < iVar43; iVar56 = iVar56 + 2) {
              auVar66 = vpblendd_avx2(*(undefined1 (*) [16])*pauVar36,
                                      *(undefined1 (*) [16])(*pauVar36 + 0x10),10);
              auVar110 = vpblendd_avx2(*(undefined1 (*) [16])(*pauVar36 + 0x10),
                                       *(undefined1 (*) [16])*pauVar36,10);
              if (iVar15 == 1) {
                auVar1._8_8_ = 0;
                auVar1._0_8_ = pauVar29;
                vpscatterdd_avx512vl(auVar1 + auVar65 * (undefined1  [16])0x4,0xffff,auVar66);
                auVar3._8_8_ = 0;
                auVar3._0_8_ = pauVar29;
                vpscatterdd_avx512vl
                          (auVar3 + ZEXT816(4) + auVar65 * (undefined1  [16])0x4,0xffff,auVar110);
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 8);
              }
              else if (iVar15 == 4) {
                *(undefined1 (*) [16])*pauVar29 = auVar66;
                *(undefined1 (*) [16])(*pauVar29 + 0x10) = auVar110;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
              }
              pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x20);
            }
            for (; iVar56 < iVar43; iVar56 = iVar56 + 1) {
              if (iVar15 == 1) {
                auVar2._8_8_ = 0;
                auVar2._0_8_ = pauVar29;
                vpscatterdd_avx512vl
                          (auVar2 + auVar65 * (undefined1  [16])0x4,0xffff,
                           *(undefined1 (*) [16])*pauVar36);
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 4);
              }
              else if (iVar15 == 4) {
                *(undefined1 (*) [16])*pauVar29 = *(undefined1 (*) [16])*pauVar36;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
              }
              pauVar36 = (undefined1 (*) [64])(*pauVar36 + 0x10);
            }
            lVar49 = lVar49 + lVar57;
            local_278 = local_278 + lVar57;
            local_260 = local_260 + lVar57;
            local_298 = local_298 + lVar57;
          }
          lVar28 = lVar46 * 8;
          for (; (long)(uVar40 | 1) < lVar19; uVar40 = uVar40 + 2) {
            pvVar21 = local_228->data;
            puVar22 = (undefined8 *)((long)pvVar21 + local_210 * 4 + (lVar18 + uVar40) * lVar46 * 4)
            ;
            local_78._0_8_ = lVar49;
            puVar50 = (undefined4 *)((long)pvVar21 + local_298);
            pauVar29 = pauVar36;
            puVar42 = (undefined4 *)(local_278 + (long)pvVar21);
            for (uVar47 = 0; (int)uVar47 + 0xf < iVar43; uVar47 = uVar47 + 0x10) {
              auVar80 = vmovdqu64_avx512f(*(undefined1 (*) [64])(*pauVar36 + uVar47 * 8));
              auVar81 = vmovdqu64_avx512f(*(undefined1 (*) [64])(pauVar36[1] + uVar47 * 8));
              auVar82 = vpunpckldq_avx512f(auVar80,auVar81);
              auVar80 = vpunpckhdq_avx512f(auVar80,auVar81);
              auVar81 = vpunpcklqdq_avx512f(auVar82,auVar80);
              auVar82 = vpermt2d_avx512f(auVar80,auVar76,auVar82);
              auVar80 = vmovdqu64_avx512f(auVar81);
              *(undefined1 (*) [64])((long)pvVar21 + uVar47 * 4 + lVar49) = auVar80;
              auVar80 = vmovdqu64_avx512f(auVar82);
              *(undefined1 (*) [64])((undefined4 *)(local_278 + (long)pvVar21) + uVar47) = auVar80;
              puVar22 = puVar22 + 8;
              pauVar29 = pauVar29 + 2;
              puVar50 = puVar50 + 0x10;
              puVar42 = puVar42 + 0x10;
            }
            for (; (int)uVar47 + 7 < iVar43; uVar47 = uVar47 + 8) {
              auVar65 = vpermilps_avx(*(undefined1 (*) [16])(*pauVar36 + uVar47 * 8 + 0x20),0xb1);
              auVar66 = vpermilps_avx(*(undefined1 (*) [16])(*pauVar36 + uVar47 * 8 + 0x30),0xb1);
              auVar113 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar36 + uVar47 * 8),auVar65);
              auVar110 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar36 + uVar47 * 8),auVar65);
              auVar112 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar36 + uVar47 * 8 + 0x10),auVar66
                                      );
              auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar36 + uVar47 * 8 + 0x10),auVar66)
              ;
              auVar65 = vmovlhps_avx(auVar113,auVar110);
              auVar66 = vmovlhps_avx(auVar112,auVar67);
              auVar110 = vshufps_avx(auVar113,auVar110,0xbb);
              auVar67 = vshufps_avx(auVar112,auVar67,0xbb);
              *(undefined1 (*) [16])((long)pvVar21 + uVar47 * 4 + lVar49) = auVar65;
              *(undefined1 (*) [16])((long)pvVar21 + uVar47 * 4 + lVar49 + 0x10) = auVar66;
              *(undefined1 (*) [16])((long)pvVar21 + uVar47 * 4 + local_260 + -0x10) = auVar110;
              *(undefined1 (*) [16])((long)pvVar21 + uVar47 * 4 + local_260) = auVar67;
              puVar22 = puVar22 + 4;
              pauVar29 = pauVar29 + 1;
              puVar50 = puVar50 + 8;
              puVar42 = puVar42 + 8;
            }
            for (; (int)uVar47 + 3 < iVar43; uVar47 = uVar47 + 4) {
              auVar66 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar36 + uVar47 * 8),
                                       *(undefined1 (*) [16])(*pauVar36 + uVar47 * 8 + 0x10));
              auVar65 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar36 + uVar47 * 8),
                                       *(undefined1 (*) [16])(*pauVar36 + uVar47 * 8 + 0x10));
              auVar110 = vpunpcklqdq_avx(auVar66,auVar65);
              auVar65 = vpunpckhdq_avx(auVar65,auVar66);
              auVar65 = vpshufd_avx(auVar65,0x36);
              *(undefined1 (*) [16])((long)pvVar21 + uVar47 * 4 + lVar49) = auVar110;
              *(undefined1 (*) [16])((long)pvVar21 + uVar47 * 4 + local_278) = auVar65;
              puVar22 = puVar22 + 2;
              pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
              puVar50 = puVar50 + 4;
              puVar42 = puVar42 + 4;
            }
            for (; (int)uVar47 + 1 < iVar43; uVar47 = (ulong)((int)uVar47 + 2)) {
              uVar5 = *(undefined4 *)(*pauVar29 + 8);
              uVar6 = *(undefined4 *)(*pauVar29 + 0xc);
              *puVar22 = *(undefined8 *)*pauVar29;
              *puVar42 = uVar5;
              *puVar50 = uVar6;
              puVar22 = puVar22 + 1;
              pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
              puVar50 = puVar50 + 2;
              puVar42 = puVar42 + 2;
            }
            lVar62 = 0;
            for (; (int)uVar47 < iVar43; uVar47 = (ulong)((int)uVar47 + 1)) {
              uVar5 = *(undefined4 *)(*pauVar29 + 4);
              *(undefined4 *)((long)puVar22 + lVar62) = *(undefined4 *)*pauVar29;
              *(undefined4 *)((long)puVar42 + lVar62) = uVar5;
              pauVar29 = (undefined1 (*) [64])(*pauVar29 + 8);
              lVar62 = lVar62 + 4;
            }
            lVar49 = lVar49 + lVar28;
            local_278 = local_278 + lVar28;
            local_260 = local_260 + lVar28;
            local_298 = local_298 + lVar28;
            pauVar36 = pauVar29;
          }
          for (; (long)uVar40 < lVar19; uVar40 = uVar40 + 1) {
            pvVar21 = local_228->data;
            pauVar29 = (undefined1 (*) [64])
                       ((long)pvVar21 + local_210 * 4 + (lVar18 + uVar40) * lVar46 * 4);
            lVar28 = 0;
            pauVar51 = pauVar36;
            for (iVar15 = 0; iVar15 + 0xf < iVar43; iVar15 = iVar15 + 0x10) {
              auVar80 = vmovdqu64_avx512f(*pauVar51);
              auVar80 = vmovdqu64_avx512f(auVar80);
              *pauVar29 = auVar80;
              pauVar29 = pauVar29 + 1;
              pauVar51 = pauVar51 + 1;
              lVar28 = lVar28 + 0x40;
            }
            for (; iVar15 + 7 < iVar43; iVar15 = iVar15 + 8) {
              puVar22 = (undefined8 *)(*pauVar36 + lVar28);
              uVar11 = puVar22[1];
              uVar12 = puVar22[2];
              uVar13 = puVar22[3];
              puVar35 = (undefined8 *)((long)pvVar21 + lVar28 + lVar49);
              *puVar35 = *puVar22;
              puVar35[1] = uVar11;
              puVar35[2] = uVar12;
              puVar35[3] = uVar13;
              lVar28 = lVar28 + 0x20;
            }
            puVar22 = (undefined8 *)((long)pvVar21 + lVar28 + lVar49);
            puVar35 = (undefined8 *)(*pauVar36 + lVar28);
            for (; iVar15 + 3 < iVar43; iVar15 = iVar15 + 4) {
              uVar11 = puVar35[1];
              *puVar22 = *puVar35;
              puVar22[1] = uVar11;
              puVar22 = puVar22 + 2;
              puVar35 = puVar35 + 2;
            }
            for (; iVar15 + 1 < iVar43; iVar15 = iVar15 + 2) {
              *puVar22 = *puVar35;
              puVar22 = puVar22 + 1;
              puVar35 = puVar35 + 1;
            }
            lVar28 = 0;
            for (; iVar15 < iVar43; iVar15 = iVar15 + 1) {
              *(undefined4 *)((long)puVar22 + lVar28) = *(undefined4 *)((long)puVar35 + lVar28);
              lVar28 = lVar28 + 4;
            }
            lVar49 = lVar49 + lVar46 * 4;
            pauVar36 = (undefined1 (*) [64])((long)puVar35 + lVar28);
          }
          pMVar58 = local_1c0;
          local_23c = iVar37;
          iVar43 = iVar37 + TILE_N;
        }
        if (m.refcount != (int *)0x0) {
          LOCK();
          *m.refcount = *m.refcount + -1;
          UNLOCK();
          if (*m.refcount == 0) {
            if (m.allocator == (Allocator *)0x0) {
              free(m.data);
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
    piVar14 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_208.allocator == (Allocator *)0x0) {
          free(local_208.data);
        }
        else {
          (*(local_208.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        free(local_1a8.data);
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return (int)local_220;
}

Assistant:

static int convolution_im2col_gemm_int8(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int nT, const Option& opt)
{
    const int maxk = kernel_w * kernel_h;

    const int M = top_blob.c * top_blob.elempack;
    const int N = top_blob.w * top_blob.h;
    const int K = bottom_blob.c * bottom_blob.elempack * maxk;

    int TILE_M, TILE_N, TILE_K;
    convolution_im2col_gemm_get_optimal_tile_mnk_int8(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        // im2col
        convolution_im2col_input_tile_int8(bottom_blob, BT_tile, j, max_jj, k, max_kk, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h);
    }

    Mat topT(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (topT.empty())
        return -100;

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                const Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                convolution_gemm_transB_packed_tile_int8(AT_tile, BT_tile, topT_tile, i, max_ii, j, max_jj, k, max_kk);
            }

            unpack_output_tile_int32(topT_tile, top_blob, i, max_ii, j, max_jj);
        }
    }

    return 0;
}